

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar57;
  byte bVar58;
  byte bVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  byte bVar63;
  bool bVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar132;
  uint uVar133;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar139;
  undefined4 uVar140;
  float fVar158;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar151 [16];
  undefined1 auVar157 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar202;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar223;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  vint4 ai;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar236;
  undefined1 auVar234 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [64];
  vint4 ai_1;
  undefined1 auVar237 [32];
  vint4 ai_2;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  float fVar249;
  float fVar250;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar251;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  float fVar267;
  float fVar268;
  undefined1 auVar266 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_904;
  int local_8ec;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  uint local_748;
  uint local_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined4 local_618;
  float local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  uint local_604;
  uint local_600;
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  ulong local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [16];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar65 = (ulong)(byte)prim[1];
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  lVar61 = uVar65 * 0x25;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x11 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  uVar140 = *(undefined4 *)(prim + lVar61 + 0x12);
  auVar73._4_4_ = uVar140;
  auVar73._0_4_ = uVar140;
  auVar73._8_4_ = uVar140;
  auVar73._12_4_ = uVar140;
  auVar67 = vsubps_avx512vl((undefined1  [16])(ray->org).field_0,
                            *(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  fVar203 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar142 = vpmovsxwd_avx(auVar82);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar165 = vpmovsxwd_avx(auVar88);
  auVar68 = vpbroadcastd_avx512vl();
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar69 = vpmovsxwd_avx512vl(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar70 = vpmovsxwd_avx512vl(auVar83);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar65 * 0x16 + 6);
  auVar71 = vpmovsxwd_avx512vl(auVar89);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar89 = vpmovsxwd_avx(auVar72);
  auVar72 = vmulps_avx512vl(auVar73,(undefined1  [16])(ray->dir).field_0);
  auVar67 = vmulps_avx512vl(auVar73,auVar67);
  auVar73 = vcvtdq2ps_avx512vl(auVar78);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar75 = vcvtdq2ps_avx512vl(auVar75);
  auVar76 = vcvtdq2ps_avx512vl(auVar76);
  auVar77 = vcvtdq2ps_avx512vl(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar80);
  auVar84 = vcvtdq2ps_avx(auVar81);
  auVar83 = vcvtdq2ps_avx(auVar19);
  auVar78 = vbroadcastss_avx512vl(auVar72);
  auVar79 = vshufps_avx512vl(auVar72,auVar72,0x55);
  auVar72 = vshufps_avx512vl(auVar72,auVar72,0xaa);
  auVar80 = vmulps_avx512vl(auVar72,auVar75);
  auVar164._0_4_ = auVar72._0_4_ * auVar82._0_4_;
  auVar164._4_4_ = auVar72._4_4_ * auVar82._4_4_;
  auVar164._8_4_ = auVar72._8_4_ * auVar82._8_4_;
  auVar164._12_4_ = auVar72._12_4_ * auVar82._12_4_;
  auVar141._0_4_ = auVar83._0_4_ * auVar72._0_4_;
  auVar141._4_4_ = auVar83._4_4_ * auVar72._4_4_;
  auVar141._8_4_ = auVar83._8_4_ * auVar72._8_4_;
  auVar141._12_4_ = auVar83._12_4_ * auVar72._12_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar79,auVar74);
  auVar81 = vfmadd231ps_avx512vl(auVar164,auVar79,auVar77);
  auVar72 = vfmadd231ps_fma(auVar141,auVar84,auVar79);
  auVar79 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar73);
  auVar80 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar76);
  auVar78 = vfmadd231ps_fma(auVar72,auVar88,auVar78);
  uVar140 = auVar67._0_4_;
  auVar262._4_4_ = uVar140;
  auVar262._0_4_ = uVar140;
  auVar262._8_4_ = uVar140;
  auVar262._12_4_ = uVar140;
  auVar81 = vshufps_avx512vl(auVar67,auVar67,0x55);
  auVar72 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar75 = vmulps_avx512vl(auVar72,auVar75);
  auVar244._0_4_ = auVar72._0_4_ * auVar82._0_4_;
  auVar244._4_4_ = auVar72._4_4_ * auVar82._4_4_;
  auVar244._8_4_ = auVar72._8_4_ * auVar82._8_4_;
  auVar244._12_4_ = auVar72._12_4_ * auVar82._12_4_;
  auVar204._0_4_ = auVar72._0_4_ * auVar83._0_4_;
  auVar204._4_4_ = auVar72._4_4_ * auVar83._4_4_;
  auVar204._8_4_ = auVar72._8_4_ * auVar83._8_4_;
  auVar204._12_4_ = auVar72._12_4_ * auVar83._12_4_;
  auVar82 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar74);
  auVar83 = vfmadd231ps_avx512vl(auVar244,auVar81,auVar77);
  auVar84 = vfmadd231ps_avx512vl(auVar204,auVar81,auVar84);
  auVar67 = vfmadd231ps_avx512vl(auVar82,auVar262,auVar73);
  auVar73 = vfmadd231ps_avx512vl(auVar83,auVar262,auVar76);
  auVar19 = vfmadd231ps_fma(auVar84,auVar262,auVar88);
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  auVar82 = vandps_avx(auVar259,auVar79);
  auVar254._8_4_ = 0x219392ef;
  auVar254._0_8_ = 0x219392ef219392ef;
  auVar254._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar82,auVar254,1);
  bVar64 = (bool)((byte)uVar57 & 1);
  auVar85._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._0_4_;
  bVar64 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._4_4_;
  bVar64 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._8_4_;
  bVar64 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._12_4_;
  auVar82 = vandps_avx(auVar259,auVar80);
  uVar57 = vcmpps_avx512vl(auVar82,auVar254,1);
  bVar64 = (bool)((byte)uVar57 & 1);
  auVar86._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._0_4_;
  bVar64 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._4_4_;
  bVar64 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._8_4_;
  bVar64 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._12_4_;
  auVar82 = vandps_avx(auVar259,auVar78);
  uVar57 = vcmpps_avx512vl(auVar82,auVar254,1);
  bVar64 = (bool)((byte)uVar57 & 1);
  auVar87._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._0_4_;
  bVar64 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._4_4_;
  bVar64 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._8_4_;
  bVar64 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._12_4_;
  auVar88 = vrcp14ps_avx512vl(auVar85);
  auVar255._8_4_ = 0x3f800000;
  auVar255._0_8_ = 0x3f8000003f800000;
  auVar255._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar85,auVar88,auVar255);
  auVar83 = vfmadd132ps_fma(auVar82,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar82 = vfnmadd213ps_fma(auVar86,auVar88,auVar255);
  auVar72 = vfmadd132ps_fma(auVar82,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar82 = vfnmadd213ps_fma(auVar87,auVar88,auVar255);
  auVar79 = vfmadd132ps_fma(auVar82,auVar88,auVar88);
  auVar229._4_4_ = fVar203;
  auVar229._0_4_ = fVar203;
  auVar229._8_4_ = fVar203;
  auVar229._12_4_ = fVar203;
  auVar82 = vcvtdq2ps_avx(auVar142);
  auVar88 = vcvtdq2ps_avx(auVar165);
  auVar88 = vsubps_avx(auVar88,auVar82);
  auVar80 = vfmadd213ps_fma(auVar88,auVar229,auVar82);
  auVar88 = vcvtdq2ps_avx512vl(auVar69);
  auVar82 = vcvtdq2ps_avx512vl(auVar70);
  auVar82 = vsubps_avx(auVar82,auVar88);
  auVar81 = vfmadd213ps_fma(auVar82,auVar229,auVar88);
  auVar82 = vcvtdq2ps_avx(auVar90);
  auVar88 = vcvtdq2ps_avx512vl(auVar71);
  auVar88 = vsubps_avx(auVar88,auVar82);
  auVar90 = vfmadd213ps_fma(auVar88,auVar229,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar89);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar88 = vpmovsxwd_avx(auVar78);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar84 = vsubps_avx(auVar88,auVar82);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar88 = vpmovsxwd_avx(auVar74);
  auVar84 = vfmadd213ps_fma(auVar84,auVar229,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar88);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar65 * 0x21 + 6);
  auVar88 = vpmovsxwd_avx(auVar75);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar82);
  auVar89 = vfmadd213ps_fma(auVar88,auVar229,auVar82);
  auVar265 = ZEXT1664(auVar89);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 * 0x1f + 6);
  auVar82 = vpmovsxwd_avx(auVar76);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar88 = vpmovsxwd_avx(auVar77);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar82);
  auVar88 = vfmadd213ps_fma(auVar88,auVar229,auVar82);
  auVar82 = vsubps_avx512vl(auVar80,auVar67);
  auVar69._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar69._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar69._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar69._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx512vl(auVar81,auVar67);
  auVar67._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar67._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar67._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar67._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar90,auVar73);
  auVar70._0_4_ = auVar72._0_4_ * auVar82._0_4_;
  auVar70._4_4_ = auVar72._4_4_ * auVar82._4_4_;
  auVar70._8_4_ = auVar72._8_4_ * auVar82._8_4_;
  auVar70._12_4_ = auVar72._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar84,auVar73);
  auVar165._0_4_ = auVar72._0_4_ * auVar82._0_4_;
  auVar165._4_4_ = auVar72._4_4_ * auVar82._4_4_;
  auVar165._8_4_ = auVar72._8_4_ * auVar82._8_4_;
  auVar165._12_4_ = auVar72._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar89,auVar19);
  auVar71._0_4_ = auVar79._0_4_ * auVar82._0_4_;
  auVar71._4_4_ = auVar79._4_4_ * auVar82._4_4_;
  auVar71._8_4_ = auVar79._8_4_ * auVar82._8_4_;
  auVar71._12_4_ = auVar79._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar88,auVar19);
  auVar142._0_4_ = auVar79._0_4_ * auVar82._0_4_;
  auVar142._4_4_ = auVar79._4_4_ * auVar82._4_4_;
  auVar142._8_4_ = auVar79._8_4_ * auVar82._8_4_;
  auVar142._12_4_ = auVar79._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar69,auVar67);
  auVar88 = vpminsd_avx(auVar70,auVar165);
  auVar82 = vmaxps_avx(auVar82,auVar88);
  auVar88 = vpminsd_avx(auVar71,auVar142);
  uVar140 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar79._4_4_ = uVar140;
  auVar79._0_4_ = uVar140;
  auVar79._8_4_ = uVar140;
  auVar79._12_4_ = uVar140;
  auVar88 = vmaxps_avx512vl(auVar88,auVar79);
  auVar82 = vmaxps_avx(auVar82,auVar88);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx(auVar69,auVar67);
  auVar88 = vpmaxsd_avx(auVar70,auVar165);
  auVar82 = vminps_avx(auVar82,auVar88);
  auVar88 = vpmaxsd_avx(auVar71,auVar142);
  fVar203 = ray->tfar;
  auVar81._4_4_ = fVar203;
  auVar81._0_4_ = fVar203;
  auVar81._8_4_ = fVar203;
  auVar81._12_4_ = fVar203;
  auVar88 = vminps_avx512vl(auVar88,auVar81);
  auVar82 = vminps_avx(auVar82,auVar88);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar19);
  uVar20 = vcmpps_avx512vl(local_380,auVar82,2);
  uVar22 = vpcmpgtd_avx512vl(auVar68,_DAT_01f4ad30);
  local_4a8 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar20 & 0xf & (byte)uVar22));
  local_5f0 = prim;
LAB_018cc3b9:
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar257 = ZEXT3264(auVar94);
  if (local_4a8 == 0) {
LAB_018cec2b:
    return local_4a8 != 0;
  }
  lVar61 = 0;
  for (uVar57 = local_4a8; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  local_5e8 = (ulong)*(uint *)(prim + lVar61 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_5e8 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar203 = (pGVar4->time_range).lower;
  fVar203 = pGVar4->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar203) / ((pGVar4->time_range).upper - fVar203));
  auVar82 = vroundss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),9);
  auVar82 = vminss_avx(auVar82,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
  fVar203 = fVar203 - auVar82._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)auVar82._0_4_ * 0x38;
  lVar61 = *(long *)(_Var5 + 0x10 + lVar60);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar60);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar60);
  pfVar1 = (float *)(lVar6 + uVar57 * lVar7);
  auVar184._0_4_ = fVar203 * *pfVar1;
  auVar184._4_4_ = fVar203 * pfVar1[1];
  auVar184._8_4_ = fVar203 * pfVar1[2];
  auVar184._12_4_ = fVar203 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar57 + 1) * lVar7);
  auVar205._0_4_ = fVar203 * *pfVar1;
  auVar205._4_4_ = fVar203 * pfVar1[1];
  auVar205._8_4_ = fVar203 * pfVar1[2];
  auVar205._12_4_ = fVar203 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar57 + 2) * lVar7);
  auVar224._0_4_ = fVar203 * *pfVar1;
  auVar224._4_4_ = fVar203 * pfVar1[1];
  auVar224._8_4_ = fVar203 * pfVar1[2];
  auVar224._12_4_ = fVar203 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar57 + 3));
  auVar166._0_4_ = fVar203 * *pfVar1;
  auVar166._4_4_ = fVar203 * pfVar1[1];
  auVar166._8_4_ = fVar203 * pfVar1[2];
  auVar166._12_4_ = fVar203 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar60);
  fVar203 = 1.0 - fVar203;
  auVar143._4_4_ = fVar203;
  auVar143._0_4_ = fVar203;
  auVar143._8_4_ = fVar203;
  auVar143._12_4_ = fVar203;
  auVar84 = vfmadd231ps_fma(auVar184,auVar143,*(undefined1 (*) [16])(lVar6 + lVar61 * uVar57));
  auVar83 = vfmadd231ps_fma(auVar205,auVar143,*(undefined1 (*) [16])(lVar6 + lVar61 * (uVar57 + 1)))
  ;
  auVar90 = vfmadd231ps_fma(auVar224,auVar143,*(undefined1 (*) [16])(lVar6 + lVar61 * (uVar57 + 2)))
  ;
  auVar89 = vfmadd231ps_fma(auVar166,auVar143,*(undefined1 (*) [16])(lVar6 + lVar61 * (uVar57 + 3)))
  ;
  auVar230._0_4_ = auVar84._0_4_ + auVar83._0_4_ + auVar90._0_4_ + auVar89._0_4_;
  auVar230._4_4_ = auVar84._4_4_ + auVar83._4_4_ + auVar90._4_4_ + auVar89._4_4_;
  auVar230._8_4_ = auVar84._8_4_ + auVar83._8_4_ + auVar90._8_4_ + auVar89._8_4_;
  auVar230._12_4_ = auVar84._12_4_ + auVar83._12_4_ + auVar90._12_4_ + auVar89._12_4_;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar68._8_4_ = 0x3e800000;
  auVar68._0_8_ = 0x3e8000003e800000;
  auVar68._12_4_ = 0x3e800000;
  auVar82 = vmulps_avx512vl(auVar230,auVar68);
  auVar82 = vsubps_avx(auVar82,(undefined1  [16])aVar2);
  auVar82 = vdpps_avx(auVar82,(undefined1  [16])aVar3,0x7f);
  auVar88 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar78 = ZEXT816(0) << 0x40;
  auVar261 = ZEXT1664(auVar78);
  auVar245._4_12_ = ZEXT812(0) << 0x20;
  auVar245._0_4_ = auVar88._0_4_;
  auVar72 = vrcp14ss_avx512f(auVar78,auVar245);
  auVar88 = vfnmadd213ss_fma(auVar72,auVar88,ZEXT416(0x40000000));
  auVar252 = ZEXT1664(auVar88);
  fVar203 = auVar82._0_4_ * auVar72._0_4_ * auVar88._0_4_;
  local_500 = ZEXT416((uint)fVar203);
  auVar231._4_4_ = fVar203;
  auVar231._0_4_ = fVar203;
  auVar231._8_4_ = fVar203;
  auVar231._12_4_ = fVar203;
  fStack_3d0 = fVar203;
  _local_3e0 = auVar231;
  fStack_3cc = fVar203;
  fStack_3c8 = fVar203;
  fStack_3c4 = fVar203;
  auVar82 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar231);
  auVar82 = vblendps_avx(auVar82,auVar78,8);
  auVar88 = vsubps_avx(auVar84,auVar82);
  uVar140 = *(undefined4 *)&(ray->dir).field_0;
  local_340._4_4_ = uVar140;
  local_340._0_4_ = uVar140;
  local_340._8_4_ = uVar140;
  local_340._12_4_ = uVar140;
  local_340._16_4_ = uVar140;
  local_340._20_4_ = uVar140;
  local_340._24_4_ = uVar140;
  local_340._28_4_ = uVar140;
  auVar248 = ZEXT3264(local_340);
  auVar84 = vsubps_avx(auVar90,auVar82);
  local_6e0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar277 = ZEXT3264(local_6e0);
  local_420 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar242 = ZEXT1664(auVar83);
  auVar82 = vsubps_avx(auVar89,auVar82);
  auVar235 = ZEXT1664(auVar82);
  local_7e0 = vbroadcastss_avx512vl(auVar88);
  auVar275 = ZEXT3264(local_7e0);
  auVar91._8_4_ = 1;
  auVar91._0_8_ = 0x100000001;
  auVar91._12_4_ = 1;
  auVar91._16_4_ = 1;
  auVar91._20_4_ = 1;
  auVar91._24_4_ = 1;
  auVar91._28_4_ = 1;
  local_560 = ZEXT1632(auVar88);
  local_800 = vpermps_avx512vl(auVar91,local_560);
  auVar269 = ZEXT3264(local_800);
  auVar92._8_4_ = 2;
  auVar92._0_8_ = 0x200000002;
  auVar92._12_4_ = 2;
  auVar92._16_4_ = 2;
  auVar92._20_4_ = 2;
  auVar92._24_4_ = 2;
  auVar92._28_4_ = 2;
  local_820 = vpermps_avx512vl(auVar92,local_560);
  auVar270 = ZEXT3264(local_820);
  auVar95._8_4_ = 3;
  auVar95._0_8_ = 0x300000003;
  auVar95._12_4_ = 3;
  auVar95._16_4_ = 3;
  auVar95._20_4_ = 3;
  auVar95._24_4_ = 3;
  auVar95._28_4_ = 3;
  local_840 = vpermps_avx512vl(auVar95,local_560);
  auVar271 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar83);
  auVar272 = ZEXT3264(local_860);
  local_5a0 = ZEXT1632(auVar83);
  local_880 = vpermps_avx512vl(auVar91,local_5a0);
  auVar273 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar92,local_5a0);
  auVar274 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar95,local_5a0);
  auVar276 = ZEXT3264(local_8c0);
  local_700 = vbroadcastss_avx512vl(auVar84);
  auVar278 = ZEXT3264(local_700);
  local_580 = ZEXT1632(auVar84);
  local_720 = vpermps_avx512vl(auVar91,local_580);
  auVar279 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar92,local_580);
  auVar280 = ZEXT3264(local_740);
  local_7c0 = vpermps_avx512vl(auVar95,local_580);
  auVar281 = ZEXT3264(local_7c0);
  local_1e0 = auVar82._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  _local_5c0 = ZEXT1632(auVar82);
  _local_200 = vpermps_avx2(auVar91,_local_5c0);
  local_260 = vpermps_avx512vl(auVar92,_local_5c0);
  local_280 = vpermps_avx2(auVar95,_local_5c0);
  auVar91 = vpermps_avx2(auVar92,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  auVar91 = vfmadd231ps_avx512vl(auVar91,local_6e0,local_6e0);
  auVar82 = vfmadd231ps_fma(auVar91,local_340,local_340);
  local_220 = ZEXT1632(auVar82);
  local_240 = vandps_avx(auVar94,ZEXT1632(auVar82));
  uVar57 = 0;
  bVar63 = 0;
  local_904 = 1;
  local_370 = ZEXT816(0x3f80000000000000);
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  do {
    auVar82 = vmovshdup_avx(local_370);
    auVar82 = vsubps_avx(auVar82,local_370);
    auVar144._0_4_ = auVar82._0_4_;
    fVar18 = auVar144._0_4_ * 0.04761905;
    uVar140 = local_370._0_4_;
    local_7a0._4_4_ = uVar140;
    local_7a0._0_4_ = uVar140;
    local_7a0._8_4_ = uVar140;
    local_7a0._12_4_ = uVar140;
    local_7a0._16_4_ = uVar140;
    local_7a0._20_4_ = uVar140;
    local_7a0._24_4_ = uVar140;
    local_7a0._28_4_ = uVar140;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    local_6c0._16_4_ = auVar144._0_4_;
    local_6c0._0_16_ = auVar144;
    local_6c0._20_4_ = auVar144._0_4_;
    local_6c0._24_4_ = auVar144._0_4_;
    local_6c0._28_4_ = auVar144._0_4_;
    auVar82 = vfmadd231ps_fma(local_7a0,local_6c0,_DAT_01f7b040);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar92 = vsubps_avx512vl(auVar91,ZEXT1632(auVar82));
    fVar243 = auVar92._0_4_;
    fVar250 = auVar92._4_4_;
    fVar222 = auVar92._8_4_;
    fVar267 = auVar92._12_4_;
    fVar183 = auVar92._16_4_;
    fVar16 = auVar92._20_4_;
    fVar17 = auVar92._24_4_;
    fVar139 = fVar243 * fVar243 * fVar243;
    fVar158 = fVar250 * fVar250 * fVar250;
    auVar96._4_4_ = fVar158;
    auVar96._0_4_ = fVar139;
    fVar159 = fVar222 * fVar222 * fVar222;
    auVar96._8_4_ = fVar159;
    fVar160 = fVar267 * fVar267 * fVar267;
    auVar96._12_4_ = fVar160;
    fVar161 = fVar183 * fVar183 * fVar183;
    auVar96._16_4_ = fVar161;
    fVar162 = fVar16 * fVar16 * fVar16;
    auVar96._20_4_ = fVar162;
    fVar163 = fVar17 * fVar17 * fVar17;
    auVar96._24_4_ = fVar163;
    auVar96._28_4_ = auVar144._0_4_;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar94 = vmulps_avx512vl(auVar96,auVar93);
    fVar249 = auVar82._0_4_;
    fVar251 = auVar82._4_4_;
    fVar223 = auVar82._8_4_;
    fVar268 = auVar82._12_4_;
    fVar182 = fVar249 * fVar249 * fVar249;
    fVar200 = fVar251 * fVar251 * fVar251;
    fVar201 = fVar223 * fVar223 * fVar223;
    fVar202 = fVar268 * fVar268 * fVar268;
    auVar253._0_4_ = fVar249 * fVar243;
    auVar253._4_4_ = fVar251 * fVar250;
    auVar253._8_4_ = fVar223 * fVar222;
    auVar253._12_4_ = fVar268 * fVar267;
    auVar253._16_4_ = fVar183 * 0.0;
    auVar253._20_4_ = fVar16 * 0.0;
    auVar253._28_36_ = auVar252._28_36_;
    auVar253._24_4_ = fVar17 * 0.0;
    fVar203 = auVar265._28_4_;
    auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar202,CONCAT48(fVar201,CONCAT44(fVar200,fVar182))
                                                )),auVar93);
    fVar258 = auVar95._28_4_ + auVar144._0_4_;
    fVar236 = fVar258 + auVar261._28_4_ + auVar235._28_4_;
    auVar102._4_4_ = fVar158 * 0.16666667;
    auVar102._0_4_ = fVar139 * 0.16666667;
    auVar102._8_4_ = fVar159 * 0.16666667;
    auVar102._12_4_ = fVar160 * 0.16666667;
    auVar102._16_4_ = fVar161 * 0.16666667;
    auVar102._20_4_ = fVar162 * 0.16666667;
    auVar102._24_4_ = fVar163 * 0.16666667;
    auVar102._28_4_ = fVar258;
    auVar98._4_4_ =
         (auVar253._4_4_ * fVar250 * 12.0 + auVar253._4_4_ * fVar251 * 6.0 + fVar200 + auVar94._4_4_
         ) * 0.16666667;
    auVar98._0_4_ =
         (auVar253._0_4_ * fVar243 * 12.0 + auVar253._0_4_ * fVar249 * 6.0 + fVar182 + auVar94._0_4_
         ) * 0.16666667;
    auVar98._8_4_ =
         (auVar253._8_4_ * fVar222 * 12.0 + auVar253._8_4_ * fVar223 * 6.0 + fVar201 + auVar94._8_4_
         ) * 0.16666667;
    auVar98._12_4_ =
         (auVar253._12_4_ * fVar267 * 12.0 + auVar253._12_4_ * fVar268 * 6.0 +
         fVar202 + auVar94._12_4_) * 0.16666667;
    auVar98._16_4_ =
         (auVar253._16_4_ * fVar183 * 12.0 + auVar253._16_4_ * 0.0 * 6.0 + auVar94._16_4_ + 0.0) *
         0.16666667;
    auVar98._20_4_ =
         (auVar253._20_4_ * fVar16 * 12.0 + auVar253._20_4_ * 0.0 * 6.0 + auVar94._20_4_ + 0.0) *
         0.16666667;
    auVar98._24_4_ =
         (auVar253._24_4_ * fVar17 * 12.0 + auVar253._24_4_ * 0.0 * 6.0 + auVar94._24_4_ + 0.0) *
         0.16666667;
    auVar98._28_4_ = auVar261._28_4_;
    auVar99._4_4_ =
         (auVar95._4_4_ + fVar158 + auVar253._4_4_ * fVar251 * 12.0 + auVar253._4_4_ * fVar250 * 6.0
         ) * 0.16666667;
    auVar99._0_4_ =
         (auVar95._0_4_ + fVar139 + auVar253._0_4_ * fVar249 * 12.0 + auVar253._0_4_ * fVar243 * 6.0
         ) * 0.16666667;
    auVar99._8_4_ =
         (auVar95._8_4_ + fVar159 + auVar253._8_4_ * fVar223 * 12.0 + auVar253._8_4_ * fVar222 * 6.0
         ) * 0.16666667;
    auVar99._12_4_ =
         (auVar95._12_4_ + fVar160 +
         auVar253._12_4_ * fVar268 * 12.0 + auVar253._12_4_ * fVar267 * 6.0) * 0.16666667;
    auVar99._16_4_ =
         (auVar95._16_4_ + fVar161 + auVar253._16_4_ * 0.0 * 12.0 + auVar253._16_4_ * fVar183 * 6.0)
         * 0.16666667;
    auVar99._20_4_ =
         (auVar95._20_4_ + fVar162 + auVar253._20_4_ * 0.0 * 12.0 + auVar253._20_4_ * fVar16 * 6.0)
         * 0.16666667;
    auVar99._24_4_ =
         (auVar95._24_4_ + fVar163 + auVar253._24_4_ * 0.0 * 12.0 + auVar253._24_4_ * fVar17 * 6.0)
         * 0.16666667;
    auVar99._28_4_ = fVar203;
    fVar182 = fVar182 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    fVar201 = fVar201 * 0.16666667;
    fVar202 = fVar202 * 0.16666667;
    auVar100._28_4_ = fVar236;
    auVar100._0_28_ = ZEXT1628(CONCAT412(fVar202,CONCAT48(fVar201,CONCAT44(fVar200,fVar182))));
    auVar101._4_4_ = fStack_1dc * fVar200;
    auVar101._0_4_ = local_1e0 * fVar182;
    auVar101._8_4_ = fStack_1d8 * fVar201;
    auVar101._12_4_ = fStack_1d4 * fVar202;
    auVar101._16_4_ = fStack_1d0 * 0.0;
    auVar101._20_4_ = fStack_1cc * 0.0;
    auVar101._24_4_ = fStack_1c8 * 0.0;
    auVar101._28_4_ = 0;
    auVar103._4_4_ = (float)local_200._4_4_ * fVar200;
    auVar103._0_4_ = (float)local_200._0_4_ * fVar182;
    auVar103._8_4_ = fStack_1f8 * fVar201;
    auVar103._12_4_ = fStack_1f4 * fVar202;
    auVar103._16_4_ = fStack_1f0 * 0.0;
    auVar103._20_4_ = fStack_1ec * 0.0;
    auVar103._24_4_ = fStack_1e8 * 0.0;
    auVar103._28_4_ = auVar257._28_4_ + fVar203 + auVar94._28_4_ + 0.0;
    auVar94 = vmulps_avx512vl(local_260,auVar100);
    auVar104._4_4_ = local_280._4_4_ * fVar200;
    auVar104._0_4_ = local_280._0_4_ * fVar182;
    auVar104._8_4_ = local_280._8_4_ * fVar201;
    auVar104._12_4_ = local_280._12_4_ * fVar202;
    auVar104._16_4_ = local_280._16_4_ * 0.0;
    auVar104._20_4_ = local_280._20_4_ * 0.0;
    auVar104._24_4_ = local_280._24_4_ * 0.0;
    auVar104._28_4_ = fVar236;
    auVar95 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar278._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar279._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar280._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar104,auVar281._0_32_,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar272._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar273._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar274._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar276._0_32_,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar275._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar269._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar270._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar271._0_32_,auVar102);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar96 = vxorps_avx512vl(auVar92,auVar101);
    auVar102 = vxorps_avx512vl(ZEXT1632(auVar82),auVar101);
    auVar227._0_4_ = auVar102._0_4_ * fVar249;
    auVar227._4_4_ = auVar102._4_4_ * fVar251;
    auVar227._8_4_ = auVar102._8_4_ * fVar223;
    auVar227._12_4_ = auVar102._12_4_ * fVar268;
    auVar227._16_4_ = auVar102._16_4_ * 0.0;
    auVar227._20_4_ = auVar102._20_4_ * 0.0;
    auVar227._24_4_ = auVar102._24_4_ * 0.0;
    auVar227._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar253._0_32_,auVar93);
    auVar94 = vsubps_avx(auVar227,auVar97);
    auVar105._4_4_ = auVar96._4_4_ * fVar250 * 0.5;
    auVar105._0_4_ = auVar96._0_4_ * fVar243 * 0.5;
    auVar105._8_4_ = auVar96._8_4_ * fVar222 * 0.5;
    auVar105._12_4_ = auVar96._12_4_ * fVar267 * 0.5;
    auVar105._16_4_ = auVar96._16_4_ * fVar183 * 0.5;
    auVar105._20_4_ = auVar96._20_4_ * fVar16 * 0.5;
    auVar105._24_4_ = auVar96._24_4_ * fVar17 * 0.5;
    auVar105._28_4_ = auVar92._28_4_;
    auVar107._4_4_ = auVar94._4_4_ * 0.5;
    auVar107._0_4_ = auVar94._0_4_ * 0.5;
    auVar107._8_4_ = auVar94._8_4_ * 0.5;
    auVar107._12_4_ = auVar94._12_4_ * 0.5;
    auVar107._16_4_ = auVar94._16_4_ * 0.5;
    auVar107._20_4_ = auVar94._20_4_ * 0.5;
    auVar107._24_4_ = auVar94._24_4_ * 0.5;
    auVar107._28_4_ = auVar94._28_4_;
    auVar108._4_4_ = (auVar97._4_4_ + fVar250 * fVar250) * 0.5;
    auVar108._0_4_ = (auVar97._0_4_ + fVar243 * fVar243) * 0.5;
    auVar108._8_4_ = (auVar97._8_4_ + fVar222 * fVar222) * 0.5;
    auVar108._12_4_ = (auVar97._12_4_ + fVar267 * fVar267) * 0.5;
    auVar108._16_4_ = (auVar97._16_4_ + fVar183 * fVar183) * 0.5;
    auVar108._20_4_ = (auVar97._20_4_ + fVar16 * fVar16) * 0.5;
    auVar108._24_4_ = (auVar97._24_4_ + fVar17 * fVar17) * 0.5;
    auVar108._28_4_ = auVar97._28_4_ + auVar242._28_4_;
    fVar243 = fVar249 * fVar249 * 0.5;
    fVar249 = fVar251 * fVar251 * 0.5;
    fVar250 = fVar223 * fVar223 * 0.5;
    fVar251 = fVar268 * fVar268 * 0.5;
    auVar109._28_4_ = auVar248._28_4_;
    auVar109._0_28_ = ZEXT1628(CONCAT412(fVar251,CONCAT48(fVar250,CONCAT44(fVar249,fVar243))));
    auVar113._4_4_ = fStack_1dc * fVar249;
    auVar113._0_4_ = local_1e0 * fVar243;
    auVar113._8_4_ = fStack_1d8 * fVar250;
    auVar113._12_4_ = fStack_1d4 * fVar251;
    auVar113._16_4_ = fStack_1d0 * 0.0;
    auVar113._20_4_ = fStack_1cc * 0.0;
    auVar113._24_4_ = fStack_1c8 * 0.0;
    auVar113._28_4_ = 0x3f000000;
    auVar114._4_4_ = (float)local_200._4_4_ * fVar249;
    auVar114._0_4_ = (float)local_200._0_4_ * fVar243;
    auVar114._8_4_ = fStack_1f8 * fVar250;
    auVar114._12_4_ = fStack_1f4 * fVar251;
    auVar114._16_4_ = fStack_1f0 * 0.0;
    auVar114._20_4_ = fStack_1ec * 0.0;
    auVar114._24_4_ = fStack_1e8 * 0.0;
    auVar114._28_4_ = auVar102._28_4_;
    auVar94 = vmulps_avx512vl(local_260,auVar109);
    auVar115._4_4_ = fVar249 * local_280._4_4_;
    auVar115._0_4_ = fVar243 * local_280._0_4_;
    auVar115._8_4_ = fVar250 * local_280._8_4_;
    auVar115._12_4_ = fVar251 * local_280._12_4_;
    auVar115._16_4_ = local_280._16_4_ * 0.0;
    auVar115._20_4_ = local_280._20_4_ * 0.0;
    auVar115._24_4_ = local_280._24_4_ * 0.0;
    auVar115._28_4_ = auVar248._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar278._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar114,auVar108,auVar279._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,auVar280._0_32_);
    auVar82 = vfmadd231ps_fma(auVar115,auVar281._0_32_,auVar108);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,auVar272._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,auVar273._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,auVar274._0_32_);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar276._0_32_,auVar107);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,auVar275._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar269._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar270._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar271._0_32_,auVar105);
    auVar120._4_4_ = auVar92._4_4_ * fVar18;
    auVar120._0_4_ = auVar92._0_4_ * fVar18;
    auVar120._8_4_ = auVar92._8_4_ * fVar18;
    auVar120._12_4_ = auVar92._12_4_ * fVar18;
    auVar120._16_4_ = auVar92._16_4_ * fVar18;
    auVar120._20_4_ = auVar92._20_4_ * fVar18;
    auVar120._24_4_ = auVar92._24_4_ * fVar18;
    auVar120._28_4_ = auVar281._28_4_;
    auVar261 = ZEXT3264(auVar120);
    auVar121._4_4_ = auVar96._4_4_ * fVar18;
    auVar121._0_4_ = auVar96._0_4_ * fVar18;
    auVar121._8_4_ = auVar96._8_4_ * fVar18;
    auVar121._12_4_ = auVar96._12_4_ * fVar18;
    auVar121._16_4_ = auVar96._16_4_ * fVar18;
    auVar121._20_4_ = auVar96._20_4_ * fVar18;
    auVar121._24_4_ = auVar96._24_4_ * fVar18;
    auVar121._28_4_ = fVar203;
    auVar265 = ZEXT3264(auVar121);
    auVar122._4_4_ = auVar94._4_4_ * fVar18;
    auVar122._0_4_ = auVar94._0_4_ * fVar18;
    auVar122._8_4_ = auVar94._8_4_ * fVar18;
    auVar122._12_4_ = auVar94._12_4_ * fVar18;
    auVar122._16_4_ = auVar94._16_4_ * fVar18;
    auVar122._20_4_ = auVar94._20_4_ * fVar18;
    auVar122._24_4_ = auVar94._24_4_ * fVar18;
    auVar122._28_4_ = auVar94._28_4_;
    fVar203 = auVar102._0_4_ * fVar18;
    fVar243 = auVar102._4_4_ * fVar18;
    auVar116._4_4_ = fVar243;
    auVar116._0_4_ = fVar203;
    fVar249 = auVar102._8_4_ * fVar18;
    auVar116._8_4_ = fVar249;
    fVar250 = auVar102._12_4_ * fVar18;
    auVar116._12_4_ = fVar250;
    fVar251 = auVar102._16_4_ * fVar18;
    auVar116._16_4_ = fVar251;
    fVar222 = auVar102._20_4_ * fVar18;
    auVar116._20_4_ = fVar222;
    fVar223 = auVar102._24_4_ * fVar18;
    auVar116._24_4_ = fVar223;
    auVar116._28_4_ = fVar18;
    auVar82 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
    auVar103 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar248 = ZEXT3264(auVar103);
    auVar104 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar252 = ZEXT3264(auVar104);
    auVar92 = ZEXT1632(auVar82);
    auVar105 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar92);
    auVar257 = ZEXT3264(auVar105);
    auVar228._0_4_ = fVar203 + auVar95._0_4_;
    auVar228._4_4_ = fVar243 + auVar95._4_4_;
    auVar228._8_4_ = fVar249 + auVar95._8_4_;
    auVar228._12_4_ = fVar250 + auVar95._12_4_;
    auVar228._16_4_ = fVar251 + auVar95._16_4_;
    auVar228._20_4_ = fVar222 + auVar95._20_4_;
    auVar228._24_4_ = fVar223 + auVar95._24_4_;
    auVar228._28_4_ = fVar18 + auVar95._28_4_;
    auVar94 = vmaxps_avx(auVar95,auVar228);
    auVar91 = vminps_avx(auVar95,auVar228);
    auVar106 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar92);
    auVar107 = vpermt2ps_avx512vl(auVar120,_DAT_01fb9fc0,auVar92);
    auVar108 = vpermt2ps_avx512vl(auVar121,_DAT_01fb9fc0,auVar92);
    auVar227 = ZEXT1632(auVar82);
    auVar109 = vpermt2ps_avx512vl(auVar122,_DAT_01fb9fc0,auVar227);
    auVar92 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar227);
    auVar92 = vsubps_avx(auVar106,auVar92);
    auVar95 = vsubps_avx(auVar103,auVar98);
    auVar242 = ZEXT3264(auVar95);
    auVar96 = vsubps_avx(auVar104,auVar99);
    auVar102 = vsubps_avx(auVar105,auVar100);
    auVar235 = ZEXT3264(auVar102);
    auVar97 = vmulps_avx512vl(auVar96,auVar122);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar121,auVar102);
    auVar110 = vmulps_avx512vl(auVar102,auVar120);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar122,auVar95);
    auVar111 = vmulps_avx512vl(auVar95,auVar121);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar120,auVar96);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar102,auVar102);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar112 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar95);
    auVar111 = vrcp14ps_avx512vl(auVar112);
    auVar97._8_4_ = 0x3f800000;
    auVar97._0_8_ = 0x3f8000003f800000;
    auVar97._12_4_ = 0x3f800000;
    auVar97._16_4_ = 0x3f800000;
    auVar97._20_4_ = 0x3f800000;
    auVar97._24_4_ = 0x3f800000;
    auVar97._28_4_ = 0x3f800000;
    auVar97 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar97);
    auVar97 = vfmadd132ps_avx512vl(auVar97,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar110,auVar97);
    auVar111 = vmulps_avx512vl(auVar96,auVar109);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar102);
    auVar113 = vmulps_avx512vl(auVar102,auVar107);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar109,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar108);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar96);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar111);
    auVar97 = vmulps_avx512vl(auVar111,auVar97);
    auVar97 = vmaxps_avx512vl(auVar110,auVar97);
    auVar97 = vsqrtps_avx512vl(auVar97);
    auVar110 = vmaxps_avx512vl(auVar92,auVar106);
    auVar94 = vmaxps_avx512vl(auVar94,auVar110);
    auVar113 = vaddps_avx512vl(auVar97,auVar94);
    auVar94 = vminps_avx(auVar92,auVar106);
    auVar94 = vminps_avx(auVar91,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar97);
    auVar106._8_4_ = 0x3f800002;
    auVar106._0_8_ = 0x3f8000023f800002;
    auVar106._12_4_ = 0x3f800002;
    auVar106._16_4_ = 0x3f800002;
    auVar106._20_4_ = 0x3f800002;
    auVar106._24_4_ = 0x3f800002;
    auVar106._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar113,auVar106);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    local_8e0 = vmulps_avx512vl(auVar94,auVar110);
    auVar94 = vmulps_avx512vl(auVar91,auVar91);
    auVar91 = vrsqrt14ps_avx512vl(auVar112);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar92 = vmulps_avx512vl(auVar112,auVar111);
    fVar203 = auVar91._0_4_;
    fVar243 = auVar91._4_4_;
    fVar249 = auVar91._8_4_;
    fVar250 = auVar91._12_4_;
    fVar251 = auVar91._16_4_;
    fVar222 = auVar91._20_4_;
    fVar223 = auVar91._24_4_;
    auVar117._4_4_ = fVar243 * fVar243 * fVar243 * auVar92._4_4_;
    auVar117._0_4_ = fVar203 * fVar203 * fVar203 * auVar92._0_4_;
    auVar117._8_4_ = fVar249 * fVar249 * fVar249 * auVar92._8_4_;
    auVar117._12_4_ = fVar250 * fVar250 * fVar250 * auVar92._12_4_;
    auVar117._16_4_ = fVar251 * fVar251 * fVar251 * auVar92._16_4_;
    auVar117._20_4_ = fVar222 * fVar222 * fVar222 * auVar92._20_4_;
    auVar117._24_4_ = fVar223 * fVar223 * fVar223 * auVar92._24_4_;
    auVar117._28_4_ = auVar113._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar117,auVar91,auVar112);
    auVar92 = vmulps_avx512vl(auVar95,auVar91);
    auVar97 = vmulps_avx512vl(auVar96,auVar91);
    auVar106 = vmulps_avx512vl(auVar102,auVar91);
    auVar110 = vsubps_avx512vl(auVar227,auVar98);
    auVar111 = vsubps_avx512vl(auVar227,auVar99);
    auVar112 = vsubps_avx512vl(auVar227,auVar100);
    auVar50._4_4_ = uStack_41c;
    auVar50._0_4_ = local_420;
    auVar50._8_4_ = uStack_418;
    auVar50._12_4_ = uStack_414;
    auVar50._16_4_ = uStack_410;
    auVar50._20_4_ = uStack_40c;
    auVar50._24_4_ = uStack_408;
    auVar50._28_4_ = uStack_404;
    auVar113 = vmulps_avx512vl(auVar50,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar277._0_32_,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_340,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(auVar50,auVar106);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar97,auVar277._0_32_);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar92,local_340);
    auVar106 = vmulps_avx512vl(auVar112,auVar106);
    auVar97 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar97);
    auVar92 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar92);
    auVar97 = vmulps_avx512vl(auVar115,auVar115);
    auVar106 = vsubps_avx512vl(local_220,auVar97);
    auVar116 = vmulps_avx512vl(auVar115,auVar92);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar92,auVar92);
    local_5e0 = vsubps_avx512vl(auVar114,auVar116);
    auVar94 = vsubps_avx512vl(local_5e0,auVar94);
    local_520 = vmulps_avx512vl(auVar113,auVar113);
    _local_540 = vmulps_avx512vl(auVar106,auVar93);
    auVar114 = vmulps_avx512vl(_local_540,auVar94);
    auVar114 = vsubps_avx512vl(local_520,auVar114);
    auVar82 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
    uVar65 = vcmpps_avx512vl(auVar114,auVar227,5);
    bVar55 = (byte)uVar65;
    if (bVar55 == 0) {
LAB_018cd0cb:
      auVar277 = ZEXT3264(local_6e0);
      auVar275 = ZEXT3264(local_7e0);
      auVar94 = vmovdqa64_avx512vl(local_800);
      auVar269 = ZEXT3264(auVar94);
      auVar270 = ZEXT3264(local_820);
      auVar94 = vmovdqa64_avx512vl(local_840);
      auVar271 = ZEXT3264(auVar94);
      auVar94 = vmovdqa64_avx512vl(local_860);
      auVar272 = ZEXT3264(auVar94);
      auVar273 = ZEXT3264(local_880);
      auVar274 = ZEXT3264(local_8a0);
      auVar276 = ZEXT3264(local_8c0);
      auVar278 = ZEXT3264(local_700);
      auVar279 = ZEXT3264(local_720);
      auVar280 = ZEXT3264(local_740);
      auVar281 = ZEXT3264(local_7c0);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar116 = vaddps_avx512vl(auVar106,auVar106);
      local_660 = vrcp14ps_avx512vl(auVar116);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar93._16_4_ = 0x3f800000;
      auVar93._20_4_ = 0x3f800000;
      auVar93._24_4_ = 0x3f800000;
      auVar93._28_4_ = 0x3f800000;
      auVar117 = vfnmadd213ps_avx512vl(local_660,auVar116,auVar93);
      auVar117 = vfmadd132ps_avx512vl(auVar117,local_660,local_660);
      _local_460 = vxorps_avx512vl(auVar113,auVar101);
      auVar101 = vsubps_avx512vl(_local_460,auVar114);
      local_440 = vmulps_avx512vl(auVar101,auVar117);
      auVar101 = vsubps_avx512vl(auVar114,auVar113);
      local_640 = vmulps_avx512vl(auVar101,auVar117);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar101,local_440);
      auVar118._0_4_ =
           (uint)(bVar55 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar117._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * auVar117._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * auVar117._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * auVar117._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * auVar117._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * auVar117._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * auVar117._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar118._28_4_ = (uint)bVar64 * auVar101._28_4_ | (uint)!bVar64 * auVar117._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar101,local_640);
      auVar119._0_4_ =
           (uint)(bVar55 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar101._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar64 * auVar114._4_4_ | (uint)!bVar64 * auVar101._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar64 * auVar114._8_4_ | (uint)!bVar64 * auVar101._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar64 * auVar114._12_4_ | (uint)!bVar64 * auVar101._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar64 * auVar114._16_4_ | (uint)!bVar64 * auVar101._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar64 * auVar114._20_4_ | (uint)!bVar64 * auVar101._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar64 * auVar114._24_4_ | (uint)!bVar64 * auVar101._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar119._28_4_ = (uint)bVar64 * auVar114._28_4_ | (uint)!bVar64 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar101);
      local_480 = vmaxps_avx512vl(local_240,auVar101);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_4a0 = vmulps_avx512vl(local_480,auVar30);
      vandps_avx512vl(auVar106,auVar101);
      uVar62 = vcmpps_avx512vl(local_4a0,local_4a0,1);
      uVar65 = uVar65 & uVar62;
      bVar59 = (byte)uVar65;
      if (bVar59 != 0) {
        uVar62 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar82),2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar94,auVar97);
        bVar58 = (byte)uVar62;
        uVar66 = (uint)(bVar58 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar132 = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * auVar94._4_4_;
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar133 = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * auVar94._8_4_;
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar134 = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * auVar94._12_4_;
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar135 = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * auVar94._16_4_;
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar136 = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * auVar94._20_4_;
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar137 = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * auVar94._24_4_;
        bVar64 = SUB81(uVar62 >> 7,0);
        uVar138 = (uint)bVar64 * auVar106._28_4_ | (uint)!bVar64 * auVar94._28_4_;
        auVar118._0_4_ = (bVar59 & 1) * uVar66 | !(bool)(bVar59 & 1) * auVar118._0_4_;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar118._4_4_ = bVar64 * uVar132 | !bVar64 * auVar118._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar118._8_4_ = bVar64 * uVar133 | !bVar64 * auVar118._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar118._12_4_ = bVar64 * uVar134 | !bVar64 * auVar118._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar118._16_4_ = bVar64 * uVar135 | !bVar64 * auVar118._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar118._20_4_ = bVar64 * uVar136 | !bVar64 * auVar118._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar118._24_4_ = bVar64 * uVar137 | !bVar64 * auVar118._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar118._28_4_ = bVar64 * uVar138 | !bVar64 * auVar118._28_4_;
        auVar94 = vblendmps_avx512vl(auVar97,auVar94);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar15 = SUB81(uVar62 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar58 & 1) * auVar94._0_4_ | !(bool)(bVar58 & 1) * uVar66) |
             !(bool)(bVar59 & 1) * auVar119._0_4_;
        bVar9 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar9 * ((uint)bVar64 * auVar94._4_4_ | !bVar64 * uVar132) |
             !bVar9 * auVar119._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar94._8_4_ | !bVar10 * uVar133) |
             !bVar64 * auVar119._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar94._12_4_ | !bVar11 * uVar134) |
             !bVar64 * auVar119._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar94._16_4_ | !bVar12 * uVar135) |
             !bVar64 * auVar119._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar64 * ((uint)bVar13 * auVar94._20_4_ | !bVar13 * uVar136) |
             !bVar64 * auVar119._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar64 * ((uint)bVar14 * auVar94._24_4_ | !bVar14 * uVar137) |
             !bVar64 * auVar119._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar64 * ((uint)bVar15 * auVar94._28_4_ | !bVar15 * uVar138) |
             !bVar64 * auVar119._28_4_;
        bVar55 = (~bVar59 | bVar58) & bVar55;
      }
      auVar51._4_4_ = uStack_41c;
      auVar51._0_4_ = local_420;
      auVar51._8_4_ = uStack_418;
      auVar51._12_4_ = uStack_414;
      auVar51._16_4_ = uStack_410;
      auVar51._20_4_ = uStack_40c;
      auVar51._24_4_ = uStack_408;
      auVar51._28_4_ = uStack_404;
      auVar281 = ZEXT3264(local_7c0);
      if ((bVar55 & 0x7f) == 0) {
        auVar277 = ZEXT3264(local_6e0);
        auVar275 = ZEXT3264(local_7e0);
        auVar94 = vmovdqa64_avx512vl(local_800);
        auVar269 = ZEXT3264(auVar94);
        auVar270 = ZEXT3264(local_820);
        auVar94 = vmovdqa64_avx512vl(local_840);
        auVar271 = ZEXT3264(auVar94);
        auVar94 = vmovdqa64_avx512vl(local_860);
        auVar272 = ZEXT3264(auVar94);
        auVar273 = ZEXT3264(local_880);
        auVar274 = ZEXT3264(local_8a0);
        auVar276 = ZEXT3264(local_8c0);
        auVar278 = ZEXT3264(local_700);
        auVar279 = ZEXT3264(local_720);
        auVar280 = ZEXT3264(local_740);
      }
      else {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar97 = vxorps_avx512vl(auVar109,auVar94);
        auVar106 = vxorps_avx512vl(auVar107,auVar94);
        auVar101 = vxorps_avx512vl(auVar108,auVar94);
        auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_500);
        auVar107 = vbroadcastss_avx512vl(auVar82);
        auVar107 = vmaxps_avx512vl(auVar107,auVar118);
        auVar82 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_500);
        auVar108 = vbroadcastss_avx512vl(auVar82);
        auVar108 = vminps_avx512vl(auVar108,auVar119);
        auVar112 = vmulps_avx512vl(auVar122,auVar112);
        auVar111 = vfmadd213ps_avx512vl(auVar111,auVar121,auVar112);
        auVar82 = vfmadd213ps_fma(auVar110,auVar120,auVar111);
        auVar110 = vmulps_avx512vl(auVar51,auVar122);
        auVar277 = ZEXT3264(local_6e0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_6e0,auVar121);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_340,auVar120);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar110,auVar111);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar20 = vcmpps_avx512vl(auVar111,auVar112,1);
        auVar109 = vxorps_avx512vl(ZEXT1632(auVar82),auVar94);
        auVar114 = vrcp14ps_avx512vl(auVar110);
        auVar120 = vxorps_avx512vl(auVar110,auVar94);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar122 = vfnmadd213ps_avx512vl(auVar114,auVar110,auVar121);
        auVar82 = vfmadd132ps_fma(auVar122,auVar114,auVar114);
        fVar203 = auVar82._0_4_ * auVar109._0_4_;
        fVar243 = auVar82._4_4_ * auVar109._4_4_;
        auVar37._4_4_ = fVar243;
        auVar37._0_4_ = fVar203;
        fVar249 = auVar82._8_4_ * auVar109._8_4_;
        auVar37._8_4_ = fVar249;
        fVar250 = auVar82._12_4_ * auVar109._12_4_;
        auVar37._12_4_ = fVar250;
        fVar251 = auVar109._16_4_ * 0.0;
        auVar37._16_4_ = fVar251;
        fVar222 = auVar109._20_4_ * 0.0;
        auVar37._20_4_ = fVar222;
        fVar223 = auVar109._24_4_ * 0.0;
        auVar37._24_4_ = fVar223;
        auVar37._28_4_ = auVar109._28_4_;
        uVar22 = vcmpps_avx512vl(auVar110,auVar120,1);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar117 = vblendmps_avx512vl(auVar37,auVar122);
        auVar123._0_4_ =
             (uint)(bVar59 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar114._0_4_;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar64 * auVar117._4_4_ | (uint)!bVar64 * auVar114._4_4_;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar64 * auVar117._8_4_ | (uint)!bVar64 * auVar114._8_4_;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar64 * auVar117._12_4_ | (uint)!bVar64 * auVar114._12_4_;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar64 * auVar117._16_4_ | (uint)!bVar64 * auVar114._16_4_;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar64 * auVar117._20_4_ | (uint)!bVar64 * auVar114._20_4_;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar64 * auVar117._24_4_ | (uint)!bVar64 * auVar114._24_4_;
        auVar123._28_4_ =
             (uint)(bVar59 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar114._28_4_;
        auVar107 = vmaxps_avx512vl(auVar107,auVar123);
        auVar261 = ZEXT3264(auVar107);
        uVar22 = vcmpps_avx512vl(auVar110,auVar120,6);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar124._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar203;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar243;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar249;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar250;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar251;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar222;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar223;
        auVar124._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar109._28_4_;
        auVar110 = vminps_avx512vl(auVar108,auVar124);
        auVar82 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar82),auVar103);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar82),auVar104);
        auVar108 = ZEXT1632(auVar82);
        auVar105 = vsubps_avx512vl(auVar108,auVar105);
        auVar105 = vmulps_avx512vl(auVar105,auVar97);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar103);
        auVar97 = vmulps_avx512vl(auVar51,auVar97);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_6e0,auVar101);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_340,auVar106);
        vandps_avx512vl(auVar97,auVar111);
        uVar20 = vcmpps_avx512vl(auVar97,auVar112,1);
        auVar106 = vxorps_avx512vl(auVar103,auVar94);
        auVar111 = vrcp14ps_avx512vl(auVar97);
        auVar94 = vxorps_avx512vl(auVar97,auVar94);
        auVar257 = ZEXT3264(auVar94);
        auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar97,auVar121);
        auVar82 = vfmadd132ps_fma(auVar112,auVar111,auVar111);
        auVar265 = ZEXT1664(auVar82);
        fVar203 = auVar82._0_4_ * auVar106._0_4_;
        fVar243 = auVar82._4_4_ * auVar106._4_4_;
        auVar38._4_4_ = fVar243;
        auVar38._0_4_ = fVar203;
        fVar249 = auVar82._8_4_ * auVar106._8_4_;
        auVar38._8_4_ = fVar249;
        fVar250 = auVar82._12_4_ * auVar106._12_4_;
        auVar38._12_4_ = fVar250;
        fVar251 = auVar106._16_4_ * 0.0;
        auVar38._16_4_ = fVar251;
        fVar222 = auVar106._20_4_ * 0.0;
        auVar38._20_4_ = fVar222;
        fVar223 = auVar106._24_4_ * 0.0;
        auVar38._24_4_ = fVar223;
        auVar38._28_4_ = auVar106._28_4_;
        uVar22 = vcmpps_avx512vl(auVar97,auVar94,1);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar112 = vblendmps_avx512vl(auVar38,auVar122);
        auVar125._0_4_ =
             (uint)(bVar59 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar111._0_4_;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar64 * auVar112._4_4_ | (uint)!bVar64 * auVar111._4_4_;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar64 * auVar112._8_4_ | (uint)!bVar64 * auVar111._8_4_;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar64 * auVar112._12_4_ | (uint)!bVar64 * auVar111._12_4_;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar64 * auVar112._16_4_ | (uint)!bVar64 * auVar111._16_4_;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar64 * auVar112._20_4_ | (uint)!bVar64 * auVar111._20_4_;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar64 * auVar112._24_4_ | (uint)!bVar64 * auVar111._24_4_;
        auVar125._28_4_ =
             (uint)(bVar59 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar111._28_4_;
        local_400 = vmaxps_avx(auVar107,auVar125);
        auVar252 = ZEXT3264(local_400);
        uVar22 = vcmpps_avx512vl(auVar97,auVar94,6);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar126._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar203;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar243;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar249;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar250;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar251;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar222;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar223;
        auVar126._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar106._28_4_;
        local_300 = vminps_avx(auVar110,auVar126);
        auVar248 = ZEXT3264(local_300);
        uVar20 = vcmpps_avx512vl(local_400,local_300,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar20;
        if (bVar55 == 0) goto LAB_018cd0cb;
        auVar97 = vmaxps_avx512vl(auVar108,local_8e0);
        auVar94 = vfmadd213ps_avx512vl(local_440,auVar115,auVar92);
        fVar203 = auVar91._0_4_;
        fVar243 = auVar91._4_4_;
        auVar39._4_4_ = fVar243 * auVar94._4_4_;
        auVar39._0_4_ = fVar203 * auVar94._0_4_;
        fVar249 = auVar91._8_4_;
        auVar39._8_4_ = fVar249 * auVar94._8_4_;
        fVar250 = auVar91._12_4_;
        auVar39._12_4_ = fVar250 * auVar94._12_4_;
        fVar251 = auVar91._16_4_;
        auVar39._16_4_ = fVar251 * auVar94._16_4_;
        fVar222 = auVar91._20_4_;
        auVar39._20_4_ = fVar222 * auVar94._20_4_;
        fVar223 = auVar91._24_4_;
        auVar39._24_4_ = fVar223 * auVar94._24_4_;
        auVar39._28_4_ = auVar94._28_4_;
        auVar94 = vfmadd213ps_avx512vl(local_640,auVar115,auVar92);
        auVar40._4_4_ = fVar243 * auVar94._4_4_;
        auVar40._0_4_ = fVar203 * auVar94._0_4_;
        auVar40._8_4_ = fVar249 * auVar94._8_4_;
        auVar40._12_4_ = fVar250 * auVar94._12_4_;
        auVar40._16_4_ = fVar251 * auVar94._16_4_;
        auVar40._20_4_ = fVar222 * auVar94._20_4_;
        auVar40._24_4_ = fVar223 * auVar94._24_4_;
        auVar40._28_4_ = auVar94._28_4_;
        auVar94 = vminps_avx512vl(auVar39,auVar121);
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar94 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
        auVar110 = vminps_avx512vl(auVar40,auVar121);
        auVar41._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar94._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar41,local_6c0,local_7a0);
        auVar94 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        auVar42._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar94._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar42,local_6c0,local_7a0);
        auVar43._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar43._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar43._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar43._28_4_ = auVar97._28_4_;
        auVar94 = vsubps_avx(local_5e0,auVar43);
        auVar44._4_4_ = auVar94._4_4_ * (float)local_540._4_4_;
        auVar44._0_4_ = auVar94._0_4_ * (float)local_540._0_4_;
        auVar44._8_4_ = auVar94._8_4_ * fStack_538;
        auVar44._12_4_ = auVar94._12_4_ * fStack_534;
        auVar44._16_4_ = auVar94._16_4_ * fStack_530;
        auVar44._20_4_ = auVar94._20_4_ * fStack_52c;
        auVar44._24_4_ = auVar94._24_4_ * fStack_528;
        auVar44._28_4_ = auVar97._28_4_;
        auVar97 = vsubps_avx(local_520,auVar44);
        uVar20 = vcmpps_avx512vl(auVar97,ZEXT832(0) << 0x20,5);
        bVar59 = (byte)uVar20;
        auVar278 = ZEXT3264(local_700);
        auVar279 = ZEXT3264(local_720);
        auVar280 = ZEXT3264(local_740);
        auVar281 = ZEXT3264(local_7c0);
        if (bVar59 == 0) {
          bVar59 = 0;
          auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar265 = ZEXT864(0) << 0x20;
          auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar252 = ZEXT864(0) << 0x20;
          auVar127._8_4_ = 0x7f800000;
          auVar127._0_8_ = 0x7f8000007f800000;
          auVar127._12_4_ = 0x7f800000;
          auVar127._16_4_ = 0x7f800000;
          auVar127._20_4_ = 0x7f800000;
          auVar127._24_4_ = 0x7f800000;
          auVar127._28_4_ = 0x7f800000;
          auVar128._8_4_ = 0xff800000;
          auVar128._0_8_ = 0xff800000ff800000;
          auVar128._12_4_ = 0xff800000;
          auVar128._16_4_ = 0xff800000;
          auVar128._20_4_ = 0xff800000;
          auVar128._24_4_ = 0xff800000;
          auVar128._28_4_ = 0xff800000;
        }
        else {
          auVar88 = vxorps_avx512vl(auVar144,auVar144);
          uVar65 = vcmpps_avx512vl(auVar97,auVar108,5);
          auVar97 = vsqrtps_avx(auVar97);
          auVar106 = vfnmadd213ps_avx512vl(auVar116,local_660,auVar121);
          auVar111 = vfmadd132ps_avx512vl(auVar106,local_660,local_660);
          auVar106 = vsubps_avx(_local_460,auVar97);
          auVar112 = vmulps_avx512vl(auVar106,auVar111);
          auVar97 = vsubps_avx512vl(auVar97,auVar113);
          auVar111 = vmulps_avx512vl(auVar97,auVar111);
          auVar97 = vfmadd213ps_avx512vl(auVar115,auVar112,auVar92);
          auVar45._4_4_ = fVar243 * auVar97._4_4_;
          auVar45._0_4_ = fVar203 * auVar97._0_4_;
          auVar45._8_4_ = fVar249 * auVar97._8_4_;
          auVar45._12_4_ = fVar250 * auVar97._12_4_;
          auVar45._16_4_ = fVar251 * auVar97._16_4_;
          auVar45._20_4_ = fVar222 * auVar97._20_4_;
          auVar45._24_4_ = fVar223 * auVar97._24_4_;
          auVar45._28_4_ = auVar110._28_4_;
          auVar97 = vmulps_avx512vl(local_340,auVar112);
          auVar106 = vmulps_avx512vl(local_6e0,auVar112);
          auVar52._4_4_ = uStack_41c;
          auVar52._0_4_ = local_420;
          auVar52._8_4_ = uStack_418;
          auVar52._12_4_ = uStack_414;
          auVar52._16_4_ = uStack_410;
          auVar52._20_4_ = uStack_40c;
          auVar52._24_4_ = uStack_408;
          auVar52._28_4_ = uStack_404;
          auVar101 = vmulps_avx512vl(auVar52,auVar112);
          auVar110 = vfmadd213ps_avx512vl(auVar95,auVar45,auVar98);
          auVar97 = vsubps_avx512vl(auVar97,auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar96,auVar45,auVar99);
          auVar110 = vsubps_avx512vl(auVar106,auVar110);
          auVar82 = vfmadd213ps_fma(auVar45,auVar102,auVar100);
          auVar106 = vsubps_avx(auVar101,ZEXT1632(auVar82));
          auVar252 = ZEXT3264(auVar106);
          auVar92 = vfmadd213ps_avx512vl(auVar115,auVar111,auVar92);
          auVar46._4_4_ = fVar243 * auVar92._4_4_;
          auVar46._0_4_ = fVar203 * auVar92._0_4_;
          auVar46._8_4_ = fVar249 * auVar92._8_4_;
          auVar46._12_4_ = fVar250 * auVar92._12_4_;
          auVar46._16_4_ = fVar251 * auVar92._16_4_;
          auVar46._20_4_ = fVar222 * auVar92._20_4_;
          auVar46._24_4_ = fVar223 * auVar92._24_4_;
          auVar46._28_4_ = auVar91._28_4_;
          auVar91 = vmulps_avx512vl(local_340,auVar111);
          auVar92 = vmulps_avx512vl(local_6e0,auVar111);
          auVar101 = vmulps_avx512vl(auVar52,auVar111);
          auVar82 = vfmadd213ps_fma(auVar95,auVar46,auVar98);
          auVar106 = vsubps_avx(auVar91,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar96,auVar46,auVar99);
          auVar91 = vsubps_avx(auVar92,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar102,auVar46,auVar100);
          auVar92 = vsubps_avx512vl(auVar101,ZEXT1632(auVar82));
          auVar265 = ZEXT3264(auVar92);
          auVar153._8_4_ = 0x7f800000;
          auVar153._0_8_ = 0x7f8000007f800000;
          auVar153._12_4_ = 0x7f800000;
          auVar153._16_4_ = 0x7f800000;
          auVar153._20_4_ = 0x7f800000;
          auVar153._24_4_ = 0x7f800000;
          auVar153._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar153,auVar112);
          bVar64 = (bool)((byte)uVar65 & 1);
          auVar127._0_4_ = (uint)bVar64 * auVar92._0_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar127._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar127._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar127._24_4_ = (uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar127._28_4_ = (uint)bVar64 * auVar92._28_4_ | (uint)!bVar64 * 0x7f800000;
          auVar197._8_4_ = 0xff800000;
          auVar197._0_8_ = 0xff800000ff800000;
          auVar197._12_4_ = 0xff800000;
          auVar197._16_4_ = 0xff800000;
          auVar197._20_4_ = 0xff800000;
          auVar197._24_4_ = 0xff800000;
          auVar197._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar197,auVar111);
          bVar64 = (bool)((byte)uVar65 & 1);
          auVar128._0_4_ = (uint)bVar64 * auVar92._0_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar128._28_4_ = (uint)bVar64 * auVar92._28_4_ | (uint)!bVar64 * -0x800000;
          auVar31._8_4_ = 0x36000000;
          auVar31._0_8_ = 0x3600000036000000;
          auVar31._12_4_ = 0x36000000;
          auVar31._16_4_ = 0x36000000;
          auVar31._20_4_ = 0x36000000;
          auVar31._24_4_ = 0x36000000;
          auVar31._28_4_ = 0x36000000;
          auVar92 = vmulps_avx512vl(local_480,auVar31);
          uVar62 = vcmpps_avx512vl(auVar92,local_4a0,0xe);
          uVar65 = uVar65 & uVar62;
          bVar58 = (byte)uVar65;
          if (bVar58 != 0) {
            uVar62 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar88),2);
            auVar240._8_4_ = 0x7f800000;
            auVar240._0_8_ = 0x7f8000007f800000;
            auVar240._12_4_ = 0x7f800000;
            auVar240._16_4_ = 0x7f800000;
            auVar240._20_4_ = 0x7f800000;
            auVar240._24_4_ = 0x7f800000;
            auVar240._28_4_ = 0x7f800000;
            auVar260._8_4_ = 0xff800000;
            auVar260._0_8_ = 0xff800000ff800000;
            auVar260._12_4_ = 0xff800000;
            auVar260._16_4_ = 0xff800000;
            auVar260._20_4_ = 0xff800000;
            auVar260._24_4_ = 0xff800000;
            auVar260._28_4_ = 0xff800000;
            auVar94 = vblendmps_avx512vl(auVar240,auVar260);
            bVar56 = (byte)uVar62;
            uVar66 = (uint)(bVar56 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar92._0_4_;
            bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
            uVar132 = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * auVar92._4_4_;
            bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
            uVar133 = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * auVar92._8_4_;
            bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
            uVar134 = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * auVar92._12_4_;
            bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
            uVar135 = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * auVar92._16_4_;
            bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
            uVar136 = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * auVar92._20_4_;
            bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
            uVar137 = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * auVar92._24_4_;
            bVar64 = SUB81(uVar62 >> 7,0);
            uVar138 = (uint)bVar64 * auVar94._28_4_ | (uint)!bVar64 * auVar92._28_4_;
            auVar127._0_4_ = (bVar58 & 1) * uVar66 | !(bool)(bVar58 & 1) * auVar127._0_4_;
            bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar127._4_4_ = bVar64 * uVar132 | !bVar64 * auVar127._4_4_;
            bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar127._8_4_ = bVar64 * uVar133 | !bVar64 * auVar127._8_4_;
            bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar127._12_4_ = bVar64 * uVar134 | !bVar64 * auVar127._12_4_;
            bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar127._16_4_ = bVar64 * uVar135 | !bVar64 * auVar127._16_4_;
            bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar127._20_4_ = bVar64 * uVar136 | !bVar64 * auVar127._20_4_;
            bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar127._24_4_ = bVar64 * uVar137 | !bVar64 * auVar127._24_4_;
            bVar64 = SUB81(uVar65 >> 7,0);
            auVar127._28_4_ = bVar64 * uVar138 | !bVar64 * auVar127._28_4_;
            auVar94 = vblendmps_avx512vl(auVar260,auVar240);
            bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar62 >> 6) & 1);
            bVar15 = SUB81(uVar62 >> 7,0);
            auVar128._0_4_ =
                 (uint)(bVar58 & 1) *
                 ((uint)(bVar56 & 1) * auVar94._0_4_ | !(bool)(bVar56 & 1) * uVar66) |
                 !(bool)(bVar58 & 1) * auVar128._0_4_;
            bVar9 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar128._4_4_ =
                 (uint)bVar9 * ((uint)bVar64 * auVar94._4_4_ | !bVar64 * uVar132) |
                 !bVar9 * auVar128._4_4_;
            bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar128._8_4_ =
                 (uint)bVar64 * ((uint)bVar10 * auVar94._8_4_ | !bVar10 * uVar133) |
                 !bVar64 * auVar128._8_4_;
            bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar128._12_4_ =
                 (uint)bVar64 * ((uint)bVar11 * auVar94._12_4_ | !bVar11 * uVar134) |
                 !bVar64 * auVar128._12_4_;
            bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar128._16_4_ =
                 (uint)bVar64 * ((uint)bVar12 * auVar94._16_4_ | !bVar12 * uVar135) |
                 !bVar64 * auVar128._16_4_;
            bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar128._20_4_ =
                 (uint)bVar64 * ((uint)bVar13 * auVar94._20_4_ | !bVar13 * uVar136) |
                 !bVar64 * auVar128._20_4_;
            bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar128._24_4_ =
                 (uint)bVar64 * ((uint)bVar14 * auVar94._24_4_ | !bVar14 * uVar137) |
                 !bVar64 * auVar128._24_4_;
            bVar64 = SUB81(uVar65 >> 7,0);
            auVar128._28_4_ =
                 (uint)bVar64 * ((uint)bVar15 * auVar94._28_4_ | !bVar15 * uVar138) |
                 !bVar64 * auVar128._28_4_;
            bVar59 = (~bVar58 | bVar56) & bVar59;
          }
        }
        auVar275 = ZEXT3264(local_7e0);
        auVar94 = vmovdqa64_avx512vl(local_800);
        auVar269 = ZEXT3264(auVar94);
        auVar270 = ZEXT3264(local_820);
        auVar94 = vmovdqa64_avx512vl(local_840);
        auVar271 = ZEXT3264(auVar94);
        auVar94 = vmovdqa64_avx512vl(local_860);
        auVar272 = ZEXT3264(auVar94);
        auVar273 = ZEXT3264(local_880);
        auVar274 = ZEXT3264(local_8a0);
        auVar276 = ZEXT3264(local_8c0);
        uVar140 = *(undefined4 *)&(ray->dir).field_0;
        auVar237._4_4_ = uVar140;
        auVar237._0_4_ = uVar140;
        auVar237._8_4_ = uVar140;
        auVar237._12_4_ = uVar140;
        auVar237._16_4_ = uVar140;
        auVar237._20_4_ = uVar140;
        auVar237._24_4_ = uVar140;
        auVar237._28_4_ = uVar140;
        uVar140 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar241._4_4_ = uVar140;
        auVar241._0_4_ = uVar140;
        auVar241._8_4_ = uVar140;
        auVar241._12_4_ = uVar140;
        auVar241._16_4_ = uVar140;
        auVar241._20_4_ = uVar140;
        auVar241._24_4_ = uVar140;
        auVar241._28_4_ = uVar140;
        auVar242 = ZEXT3264(auVar241);
        fVar203 = (ray->dir).field_0.m128[2];
        auVar261 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
        auVar257._0_4_ = fVar203 * auVar265._0_4_;
        auVar257._4_4_ = fVar203 * auVar265._4_4_;
        auVar257._8_4_ = fVar203 * auVar265._8_4_;
        auVar257._12_4_ = fVar203 * auVar265._12_4_;
        auVar257._16_4_ = fVar203 * auVar265._16_4_;
        auVar257._20_4_ = fVar203 * auVar265._20_4_;
        auVar257._28_36_ = auVar265._28_36_;
        auVar257._24_4_ = fVar203 * auVar265._24_4_;
        auVar82 = vfmadd231ps_fma(auVar257._0_32_,auVar241,auVar91);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar237,auVar106);
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar256._16_4_ = 0x7fffffff;
        auVar256._20_4_ = 0x7fffffff;
        auVar256._24_4_ = 0x7fffffff;
        auVar256._28_4_ = 0x7fffffff;
        auVar257 = ZEXT3264(auVar256);
        auVar94 = vandps_avx(auVar256,ZEXT1632(auVar82));
        auVar265 = ZEXT3264(local_400);
        _local_2e0 = local_400;
        auVar234._8_4_ = 0x3e99999a;
        auVar234._0_8_ = 0x3e99999a3e99999a;
        auVar234._12_4_ = 0x3e99999a;
        auVar234._16_4_ = 0x3e99999a;
        auVar234._20_4_ = 0x3e99999a;
        auVar234._24_4_ = 0x3e99999a;
        auVar234._28_4_ = 0x3e99999a;
        uVar20 = vcmpps_avx512vl(auVar94,auVar234,1);
        _local_3c0 = vmaxps_avx(local_400,auVar128);
        auVar235 = ZEXT3264(_local_3c0);
        auVar94 = vminps_avx(local_300,auVar127);
        uVar22 = vcmpps_avx512vl(local_400,auVar94,2);
        bVar58 = (byte)uVar22 & bVar55;
        uVar21 = vcmpps_avx512vl(_local_3c0,local_300,2);
        if ((bVar55 & ((byte)uVar21 | (byte)uVar22)) != 0) {
          local_748 = (uint)(byte)((byte)uVar20 | ~bVar59);
          auVar47._4_4_ = auVar252._4_4_ * fVar203;
          auVar47._0_4_ = auVar252._0_4_ * fVar203;
          auVar47._8_4_ = auVar252._8_4_ * fVar203;
          auVar47._12_4_ = auVar252._12_4_ * fVar203;
          auVar47._16_4_ = auVar252._16_4_ * fVar203;
          auVar47._20_4_ = auVar252._20_4_ * fVar203;
          auVar47._24_4_ = auVar252._24_4_ * fVar203;
          auVar47._28_4_ = auVar94._28_4_;
          auVar82 = vfmadd213ps_fma(auVar110,auVar241,auVar47);
          auVar82 = vfmadd213ps_fma(auVar97,auVar237,ZEXT1632(auVar82));
          auVar94 = vandps_avx(auVar256,ZEXT1632(auVar82));
          uVar20 = vcmpps_avx512vl(auVar94,auVar234,1);
          bVar59 = (byte)uVar20 | ~bVar59;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar154,auVar32);
          local_2a0._0_4_ = (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
          bVar64 = (bool)(bVar59 >> 1 & 1);
          local_2a0._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 2 & 1);
          local_2a0._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 3 & 1);
          local_2a0._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 4 & 1);
          local_2a0._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 5 & 1);
          local_2a0._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 6 & 1);
          local_2a0._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * 2;
          local_2a0._28_4_ = (uint)(bVar59 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
          local_360 = vpbroadcastd_avx512vl();
          uVar20 = vpcmpd_avx512vl(local_360,local_2a0,5);
          local_744 = (uint)bVar58;
          local_3a0 = local_400._0_4_ + (float)local_3e0._0_4_;
          fStack_39c = local_400._4_4_ + (float)local_3e0._4_4_;
          fStack_398 = local_400._8_4_ + fStack_3d8;
          fStack_394 = local_400._12_4_ + fStack_3d4;
          fStack_390 = local_400._16_4_ + fStack_3d0;
          fStack_38c = local_400._20_4_ + fStack_3cc;
          fStack_388 = local_400._24_4_ + fStack_3c8;
          fStack_384 = local_400._28_4_ + fStack_3c4;
          _local_320 = _local_3c0;
          for (bVar58 = (byte)uVar20 & bVar58; auVar94 = local_8e0, bVar58 != 0;
              bVar58 = ~bVar59 & bVar58 & (byte)uVar20) {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar155,local_400);
            auVar129._0_4_ =
                 (uint)(bVar58 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar64 * auVar91._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar64 * auVar91._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar64 * auVar91._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar64 * auVar91._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar64 * auVar91._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 6 & 1);
            auVar129._24_4_ = (uint)bVar64 * auVar91._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar129._28_4_ =
                 (uint)(bVar58 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar58 >> 7) * 0x7f800000;
            auVar91 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar91 = vminps_avx(auVar129,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar20 = vcmpps_avx512vl(auVar129,auVar91,0);
            bVar56 = (byte)uVar20 & bVar58;
            bVar59 = bVar58;
            if (bVar56 != 0) {
              bVar59 = bVar56;
            }
            iVar23 = 0;
            for (uVar66 = (uint)bVar59; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            bVar59 = '\x01' << ((byte)iVar23 & 0x1f);
            auVar242 = ZEXT464(*(uint *)(local_2e0 + (uint)(iVar23 << 2)));
            aVar2 = (ray->dir).field_0;
            local_520._0_16_ = (undefined1  [16])aVar2;
            auVar82 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar58;
              local_8e0._2_30_ = auVar94._2_30_;
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
              local_6c0._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar23 << 2)));
              auVar248 = ZEXT1664(auVar248._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar203 = sqrtf(auVar82._0_4_);
              auVar242 = ZEXT1664(local_6c0._0_16_);
              bVar58 = local_8e0[0];
              auVar281 = ZEXT3264(local_7c0);
              auVar280 = ZEXT3264(local_740);
              auVar279 = ZEXT3264(local_720);
              auVar278 = ZEXT3264(local_700);
              auVar276 = ZEXT3264(local_8c0);
              auVar274 = ZEXT3264(local_8a0);
              auVar273 = ZEXT3264(local_880);
              auVar94 = vmovdqa64_avx512vl(local_860);
              auVar272 = ZEXT3264(auVar94);
              auVar94 = vmovdqa64_avx512vl(local_840);
              auVar271 = ZEXT3264(auVar94);
              auVar270 = ZEXT3264(local_820);
              auVar94 = vmovdqa64_avx512vl(local_800);
              auVar269 = ZEXT3264(auVar94);
              auVar275 = ZEXT3264(local_7e0);
              auVar277 = ZEXT3264(local_6e0);
              auVar82 = local_7a0._0_16_;
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar203 = auVar82._0_4_;
              auVar82 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
            }
            uVar65 = (ulong)bVar59;
            auVar84 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar88 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar235 = ZEXT3264(_local_5c0);
            auVar83 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar90 = vminps_avx(auVar84,auVar83);
            auVar84 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar83 = vmaxps_avx(auVar88,auVar84);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar90,auVar206);
            auVar84 = vandps_avx(auVar83,auVar206);
            auVar88 = vmaxps_avx(auVar88,auVar84);
            auVar84 = vmovshdup_avx(auVar88);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            fVar243 = auVar88._0_4_ * 1.9073486e-06;
            local_4f0 = vshufps_avx(auVar83,auVar83,0xff);
            auVar82 = vinsertps_avx(auVar242._0_16_,auVar82,0x10);
            auVar252 = ZEXT1664(auVar82);
            uVar62 = 0;
            while( true ) {
              bVar56 = (byte)uVar65;
              if (uVar62 == 5) break;
              uVar140 = auVar252._0_4_;
              auVar145._4_4_ = uVar140;
              auVar145._0_4_ = uVar140;
              auVar145._8_4_ = uVar140;
              auVar145._12_4_ = uVar140;
              auVar88 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_520._0_16_);
              _local_540 = auVar252._0_16_;
              auVar82 = vmovshdup_avx(auVar252._0_16_);
              fVar223 = auVar82._0_4_;
              fVar222 = 1.0 - fVar223;
              fVar251 = fVar222 * fVar222 * fVar222;
              fVar249 = fVar223 * fVar223;
              fVar267 = fVar249 * fVar223;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar267));
              fVar250 = fVar223 * fVar222;
              local_7a0._0_16_ = ZEXT416((uint)fVar222);
              local_8e0._0_16_ = auVar82;
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar223 * 6.0)),
                                        ZEXT416((uint)(fVar250 * fVar222)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                        ZEXT416((uint)fVar251));
              auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar222 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar250 * fVar223)));
              fVar251 = fVar251 * 0.16666667;
              fVar222 = (auVar84._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar223 = (auVar82._0_4_ + auVar90._0_4_) * 0.16666667;
              fVar267 = fVar267 * 0.16666667;
              auVar185._0_4_ = fVar267 * (float)local_5c0._0_4_;
              auVar185._4_4_ = fVar267 * (float)local_5c0._4_4_;
              auVar185._8_4_ = fVar267 * fStack_5b8;
              auVar185._12_4_ = fVar267 * fStack_5b4;
              auVar225._4_4_ = fVar223;
              auVar225._0_4_ = fVar223;
              auVar225._8_4_ = fVar223;
              auVar225._12_4_ = fVar223;
              auVar82 = vfmadd132ps_fma(auVar225,auVar185,local_580._0_16_);
              auVar186._4_4_ = fVar222;
              auVar186._0_4_ = fVar222;
              auVar186._8_4_ = fVar222;
              auVar186._12_4_ = fVar222;
              auVar82 = vfmadd132ps_fma(auVar186,auVar82,local_5a0._0_16_);
              auVar167._4_4_ = fVar251;
              auVar167._0_4_ = fVar251;
              auVar167._8_4_ = fVar251;
              auVar167._12_4_ = fVar251;
              auVar82 = vfmadd132ps_fma(auVar167,auVar82,local_560._0_16_);
              local_440._0_16_ = auVar82;
              auVar82 = vsubps_avx(auVar88,auVar82);
              local_6c0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_5e0._0_16_ = auVar82;
              if (auVar82._0_4_ < 0.0) {
                local_640._0_4_ = fVar249;
                local_660._0_4_ = fVar250;
                auVar265._0_4_ = sqrtf(auVar82._0_4_);
                auVar265._4_60_ = extraout_var;
                auVar82 = auVar265._0_16_;
                uVar65 = extraout_RAX;
                fVar250 = (float)local_660._0_4_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_640._0_4_ = fVar249;
              }
              local_460._4_4_ = local_7a0._0_4_;
              local_460._0_4_ = local_460._4_4_;
              fStack_458 = (float)local_460._4_4_;
              fStack_454 = (float)local_460._4_4_;
              auVar84 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                         ZEXT416((uint)(fVar250 * 4.0)));
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),local_7a0._0_16_,
                                        local_7a0._0_16_);
              fVar249 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
              fVar250 = auVar84._0_4_ * 0.5;
              fVar251 = auVar88._0_4_ * 0.5;
              local_640._0_4_ = (float)local_640._0_4_ * 0.5;
              auVar207._0_4_ = (float)local_640._0_4_ * (float)local_5c0._0_4_;
              auVar207._4_4_ = (float)local_640._0_4_ * (float)local_5c0._4_4_;
              auVar207._8_4_ = (float)local_640._0_4_ * fStack_5b8;
              auVar207._12_4_ = (float)local_640._0_4_ * fStack_5b4;
              auVar168._4_4_ = fVar251;
              auVar168._0_4_ = fVar251;
              auVar168._8_4_ = fVar251;
              auVar168._12_4_ = fVar251;
              auVar88 = vfmadd132ps_fma(auVar168,auVar207,local_580._0_16_);
              auVar187._4_4_ = fVar250;
              auVar187._0_4_ = fVar250;
              auVar187._8_4_ = fVar250;
              auVar187._12_4_ = fVar250;
              auVar88 = vfmadd132ps_fma(auVar187,auVar88,local_5a0._0_16_);
              auVar263._4_4_ = fVar249;
              auVar263._0_4_ = fVar249;
              auVar263._8_4_ = fVar249;
              auVar263._12_4_ = fVar249;
              local_640._0_16_ = vfmadd132ps_fma(auVar263,auVar88,local_560._0_16_);
              local_480._0_16_ = vdpps_avx(local_640._0_16_,local_640._0_16_,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar249 = local_480._0_4_;
              _local_760 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar249));
              fVar250 = local_760._0_4_;
              local_4a0._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar249));
              auVar88 = vfnmadd213ss_fma(local_4a0._0_16_,local_480._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar82._0_4_;
              if (fVar249 < -fVar249) {
                local_770._0_4_ = fVar249 * -0.5;
                fVar251 = sqrtf(fVar249);
                auVar82 = ZEXT416((uint)local_660._0_4_);
                uVar65 = extraout_RAX_00;
                fVar249 = (float)local_770._0_4_;
                auVar84 = local_640._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
                fVar251 = auVar84._0_4_;
                fVar249 = fVar249 * -0.5;
                auVar84 = local_640._0_16_;
              }
              fVar222 = local_760._0_4_;
              fVar249 = fVar250 * 1.5 + fVar249 * fVar222 * fVar222 * fVar222;
              local_760._0_4_ = auVar84._0_4_ * fVar249;
              local_760._4_4_ = auVar84._4_4_ * fVar249;
              fStack_758 = auVar84._8_4_ * fVar249;
              fStack_754 = auVar84._12_4_ * fVar249;
              auVar83 = vdpps_avx(local_6c0._0_16_,_local_760,0x7f);
              fVar222 = auVar82._0_4_;
              auVar146._0_4_ = auVar83._0_4_ * auVar83._0_4_;
              auVar146._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar146._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar146._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar90 = vsubps_avx(local_5e0._0_16_,auVar146);
              fVar250 = auVar90._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar250;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar72 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar90,ZEXT416(0xbf000000));
              if (fVar250 < 0.0) {
                local_4d0._0_4_ = auVar78._0_4_;
                local_770 = auVar83;
                local_4e0 = fVar249;
                fStack_4dc = fVar249;
                fStack_4d8 = fVar249;
                fStack_4d4 = fVar249;
                local_4c0 = auVar89;
                fVar250 = sqrtf(fVar250);
                auVar78 = ZEXT416((uint)local_4d0._0_4_);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar82 = ZEXT416((uint)local_660._0_4_);
                uVar65 = extraout_RAX_01;
                auVar89 = local_4c0;
                auVar84 = local_640._0_16_;
                auVar83 = local_770;
                fVar249 = local_4e0;
                fVar223 = fStack_4dc;
                fVar267 = fStack_4d8;
                fVar268 = fStack_4d4;
              }
              else {
                auVar90 = vsqrtss_avx(auVar90,auVar90);
                fVar250 = auVar90._0_4_;
                fVar223 = fVar249;
                fVar267 = fVar249;
                fVar268 = fVar249;
              }
              auVar265 = ZEXT1664(auVar84);
              auVar261 = ZEXT1664(local_5e0._0_16_);
              auVar257 = ZEXT1664(local_6c0._0_16_);
              auVar277 = ZEXT3264(local_6e0);
              auVar275 = ZEXT3264(local_7e0);
              auVar94 = vmovdqa64_avx512vl(local_800);
              auVar269 = ZEXT3264(auVar94);
              auVar270 = ZEXT3264(local_820);
              auVar94 = vmovdqa64_avx512vl(local_840);
              auVar271 = ZEXT3264(auVar94);
              auVar94 = vmovdqa64_avx512vl(local_860);
              auVar272 = ZEXT3264(auVar94);
              auVar273 = ZEXT3264(local_880);
              auVar274 = ZEXT3264(local_8a0);
              auVar276 = ZEXT3264(local_8c0);
              auVar278 = ZEXT3264(local_700);
              auVar279 = ZEXT3264(local_720);
              auVar280 = ZEXT3264(local_740);
              auVar281 = ZEXT3264(local_7c0);
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                        local_8e0._0_16_);
              auVar75 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_7a0._0_16_);
              auVar90 = vshufps_avx(_local_540,_local_540,0x55);
              auVar188._0_4_ = auVar90._0_4_ * (float)local_5c0._0_4_;
              auVar188._4_4_ = auVar90._4_4_ * (float)local_5c0._4_4_;
              auVar188._8_4_ = auVar90._8_4_ * fStack_5b8;
              auVar188._12_4_ = auVar90._12_4_ * fStack_5b4;
              auVar208._0_4_ = auVar75._0_4_;
              auVar208._4_4_ = auVar208._0_4_;
              auVar208._8_4_ = auVar208._0_4_;
              auVar208._12_4_ = auVar208._0_4_;
              auVar90 = vfmadd132ps_fma(auVar208,auVar188,local_580._0_16_);
              auVar170._0_4_ = auVar74._0_4_;
              auVar170._4_4_ = auVar170._0_4_;
              auVar170._8_4_ = auVar170._0_4_;
              auVar170._12_4_ = auVar170._0_4_;
              auVar90 = vfmadd132ps_fma(auVar170,auVar90,local_5a0._0_16_);
              auVar90 = vfmadd132ps_fma(_local_460,auVar90,local_560._0_16_);
              auVar171._0_4_ = auVar90._0_4_ * (float)local_480._0_4_;
              auVar171._4_4_ = auVar90._4_4_ * (float)local_480._0_4_;
              auVar171._8_4_ = auVar90._8_4_ * (float)local_480._0_4_;
              auVar171._12_4_ = auVar90._12_4_ * (float)local_480._0_4_;
              auVar90 = vdpps_avx(auVar84,auVar90,0x7f);
              fVar183 = auVar90._0_4_;
              auVar189._0_4_ = auVar84._0_4_ * fVar183;
              auVar189._4_4_ = auVar84._4_4_ * fVar183;
              auVar189._8_4_ = auVar84._8_4_ * fVar183;
              auVar189._12_4_ = auVar84._12_4_ * fVar183;
              auVar90 = vsubps_avx(auVar171,auVar189);
              fVar183 = auVar88._0_4_ * (float)local_4a0._0_4_;
              auVar74 = vmaxss_avx(ZEXT416((uint)fVar243),
                                   ZEXT416((uint)(local_540._0_4_ * fVar203 * 1.9073486e-06)));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar84,auVar24);
              auVar190._0_4_ = fVar249 * auVar90._0_4_ * fVar183;
              auVar190._4_4_ = fVar223 * auVar90._4_4_ * fVar183;
              auVar190._8_4_ = fVar267 * auVar90._8_4_ * fVar183;
              auVar190._12_4_ = fVar268 * auVar90._12_4_ * fVar183;
              auVar88 = vdpps_avx(auVar76,_local_760,0x7f);
              auVar90 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar243),auVar74);
              auVar82 = vdpps_avx(local_6c0._0_16_,auVar190,0x7f);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                        ZEXT416((uint)(fVar243 / fVar251)),auVar90);
              fVar249 = auVar88._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_520._0_16_,_local_760,0x7f);
              auVar88 = vdpps_avx(local_6c0._0_16_,auVar76,0x7f);
              auVar90 = vmulss_avx512f(auVar78,auVar89);
              auVar78 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar90._0_4_ *
                                                             auVar89._0_4_ * auVar89._0_4_)));
              auVar90 = vdpps_avx(local_6c0._0_16_,local_520._0_16_,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar88,auVar83,ZEXT416((uint)fVar249));
              auVar90 = vfnmadd231ss_fma(auVar90,auVar83,auVar82);
              auVar88 = vpermilps_avx(local_440._0_16_,0xff);
              fVar250 = fVar250 - auVar88._0_4_;
              auVar89 = vshufps_avx(auVar84,auVar84,0xff);
              auVar88 = vfmsub213ss_fma(auVar72,auVar78,auVar89);
              auVar246._8_4_ = 0x80000000;
              auVar246._0_8_ = 0x8000000080000000;
              auVar246._12_4_ = 0x80000000;
              auVar248 = ZEXT1664(auVar246);
              auVar238._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar242 = ZEXT1664(auVar238);
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * auVar78._0_4_));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar249),auVar90);
              auVar88 = vinsertps_avx(auVar238,auVar90,0x1c);
              auVar232._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar249),auVar232,0x10);
              auVar209._0_4_ = auVar72._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar82 = vdivps_avx(auVar88,auVar209);
              auVar88 = vdivps_avx(auVar90,auVar209);
              fVar249 = auVar83._0_4_;
              auVar235 = ZEXT1664(CONCAT412(fVar250,CONCAT48(fVar250,CONCAT44(fVar250,fVar250))));
              auVar210._0_4_ = fVar249 * auVar82._0_4_ + fVar250 * auVar88._0_4_;
              auVar210._4_4_ = fVar249 * auVar82._4_4_ + fVar250 * auVar88._4_4_;
              auVar210._8_4_ = fVar249 * auVar82._8_4_ + fVar250 * auVar88._8_4_;
              auVar210._12_4_ = fVar249 * auVar82._12_4_ + fVar250 * auVar88._12_4_;
              auVar82 = vsubps_avx(_local_540,auVar210);
              auVar252 = ZEXT1664(auVar82);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar83,auVar25);
              if (auVar88._0_4_ < auVar75._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar74._0_4_)),local_4f0,
                                          ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar250),auVar26);
                if (auVar83._0_4_ < auVar88._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar203 = auVar82._0_4_ + (float)local_500._0_4_;
                  bVar56 = 0;
                  if ((fVar203 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar203))
                  goto LAB_018cdb0c;
                  auVar88 = vmovshdup_avx(auVar82);
                  fVar243 = auVar88._0_4_;
                  bVar56 = 0;
                  if ((fVar243 < 0.0) || (bVar56 = 0, 1.0 < fVar243)) goto LAB_018cdb0c;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                  fVar250 = auVar88._0_4_;
                  fVar249 = local_5e0._0_4_ * -0.5;
                  auVar235 = ZEXT464((uint)fVar249);
                  pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                  if ((pGVar4->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar56 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_018cdb0c;
                    local_8e0._0_4_ = ray->tfar;
                    fVar249 = fVar250 * 1.5 + fVar249 * fVar250 * fVar250 * fVar250;
                    auVar211._0_4_ = local_6c0._0_4_ * fVar249;
                    auVar211._4_4_ = local_6c0._4_4_ * fVar249;
                    auVar211._8_4_ = local_6c0._8_4_ * fVar249;
                    auVar211._12_4_ = local_6c0._12_4_ * fVar249;
                    auVar89 = vfmadd213ps_fma(auVar89,auVar211,auVar84);
                    auVar88 = vshufps_avx(auVar211,auVar211,0xc9);
                    auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar212._0_4_ = auVar211._0_4_ * auVar83._0_4_;
                    auVar212._4_4_ = auVar211._4_4_ * auVar83._4_4_;
                    auVar212._8_4_ = auVar211._8_4_ * auVar83._8_4_;
                    auVar212._12_4_ = auVar211._12_4_ * auVar83._12_4_;
                    auVar90 = vfmsub231ps_fma(auVar212,auVar84,auVar88);
                    auVar88 = vshufps_avx(auVar90,auVar90,0xc9);
                    auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                    auVar235 = ZEXT1664(auVar83);
                    auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                    auVar147._0_4_ = auVar89._0_4_ * auVar90._0_4_;
                    auVar147._4_4_ = auVar89._4_4_ * auVar90._4_4_;
                    auVar147._8_4_ = auVar89._8_4_ * auVar90._8_4_;
                    auVar147._12_4_ = auVar89._12_4_ * auVar90._12_4_;
                    auVar90 = vfmsub231ps_fma(auVar147,auVar88,auVar83);
                    auVar88 = vshufps_avx(auVar90,auVar90,0xe9);
                    local_620 = vmovlps_avx(auVar88);
                    local_618 = auVar90._0_4_;
                    local_610 = 0;
                    local_60c = (undefined4)local_5e8;
                    local_608 = (undefined4)local_8e8;
                    local_604 = context->user->instID[0];
                    local_600 = context->user->instPrimID[0];
                    ray->tfar = fVar203;
                    local_8ec = -1;
                    local_690.valid = &local_8ec;
                    local_690.geometryUserPtr = pGVar4->userPtr;
                    local_690.context = context->user;
                    local_690.hit = (RTCHitN *)&local_620;
                    local_690.N = 1;
                    local_7a0._0_8_ = pGVar4;
                    local_690.ray = (RTCRayN *)ray;
                    local_614 = fVar243;
                    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018cdd76:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar235 = ZEXT1664(auVar235._0_16_);
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        auVar252 = ZEXT1664(auVar252._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        (*p_Var8)(&local_690);
                        auVar281 = ZEXT3264(local_7c0);
                        auVar280 = ZEXT3264(local_740);
                        auVar279 = ZEXT3264(local_720);
                        auVar278 = ZEXT3264(local_700);
                        auVar276 = ZEXT3264(local_8c0);
                        auVar274 = ZEXT3264(local_8a0);
                        auVar273 = ZEXT3264(local_880);
                        auVar94 = vmovdqa64_avx512vl(local_860);
                        auVar272 = ZEXT3264(auVar94);
                        auVar94 = vmovdqa64_avx512vl(local_840);
                        auVar271 = ZEXT3264(auVar94);
                        auVar270 = ZEXT3264(local_820);
                        auVar94 = vmovdqa64_avx512vl(local_800);
                        auVar269 = ZEXT3264(auVar94);
                        auVar275 = ZEXT3264(local_7e0);
                        auVar277 = ZEXT3264(local_6e0);
                        if (*local_690.valid == 0) goto LAB_018cde2c;
                      }
                      bVar56 = 1;
                      goto LAB_018cdb0c;
                    }
                    auVar235 = ZEXT1664(auVar83);
                    auVar242 = ZEXT1664(auVar238);
                    auVar248 = ZEXT1664(auVar246);
                    auVar252 = ZEXT1664(auVar82);
                    auVar257 = ZEXT1664(local_6c0._0_16_);
                    auVar261 = ZEXT1664(local_5e0._0_16_);
                    auVar265 = ZEXT1664(auVar84);
                    (*pGVar4->occlusionFilterN)(&local_690);
                    auVar281 = ZEXT3264(local_7c0);
                    auVar280 = ZEXT3264(local_740);
                    auVar279 = ZEXT3264(local_720);
                    auVar278 = ZEXT3264(local_700);
                    auVar276 = ZEXT3264(local_8c0);
                    auVar274 = ZEXT3264(local_8a0);
                    auVar273 = ZEXT3264(local_880);
                    auVar94 = vmovdqa64_avx512vl(local_860);
                    auVar272 = ZEXT3264(auVar94);
                    auVar94 = vmovdqa64_avx512vl(local_840);
                    auVar271 = ZEXT3264(auVar94);
                    auVar270 = ZEXT3264(local_820);
                    auVar94 = vmovdqa64_avx512vl(local_800);
                    auVar269 = ZEXT3264(auVar94);
                    auVar275 = ZEXT3264(local_7e0);
                    auVar277 = ZEXT3264(local_6e0);
                    if (*local_690.valid != 0) goto LAB_018cdd76;
LAB_018cde2c:
                    ray->tfar = (float)local_8e0._0_4_;
                  }
                  bVar56 = 0;
                  goto LAB_018cdb0c;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar64 = false;
LAB_018cdb0c:
            bVar63 = bVar63 | bVar64 & bVar56;
            auVar53._4_4_ = fStack_39c;
            auVar53._0_4_ = local_3a0;
            auVar53._8_4_ = fStack_398;
            auVar53._12_4_ = fStack_394;
            auVar53._16_4_ = fStack_390;
            auVar53._20_4_ = fStack_38c;
            auVar53._24_4_ = fStack_388;
            auVar53._28_4_ = fStack_384;
            fVar203 = ray->tfar;
            auVar33._4_4_ = fVar203;
            auVar33._0_4_ = fVar203;
            auVar33._8_4_ = fVar203;
            auVar33._12_4_ = fVar203;
            auVar33._16_4_ = fVar203;
            auVar33._20_4_ = fVar203;
            auVar33._24_4_ = fVar203;
            auVar33._28_4_ = fVar203;
            uVar20 = vcmpps_avx512vl(auVar53,auVar33,2);
          }
          auVar177._0_4_ = (float)local_3e0._0_4_ + (float)local_3c0._0_4_;
          auVar177._4_4_ = (float)local_3e0._4_4_ + (float)local_3c0._4_4_;
          auVar177._8_4_ = fStack_3d8 + fStack_3b8;
          auVar177._12_4_ = fStack_3d4 + fStack_3b4;
          auVar177._16_4_ = fStack_3d0 + fStack_3b0;
          auVar177._20_4_ = fStack_3cc + fStack_3ac;
          auVar177._24_4_ = fStack_3c8 + fStack_3a8;
          auVar177._28_4_ = fStack_3c4 + fStack_3a4;
          fVar243 = ray->tfar;
          fVar203 = ray->tfar;
          auVar34._4_4_ = fVar203;
          auVar34._0_4_ = fVar203;
          auVar34._8_4_ = fVar203;
          auVar34._12_4_ = fVar203;
          auVar34._16_4_ = fVar203;
          auVar34._20_4_ = fVar203;
          auVar34._24_4_ = fVar203;
          auVar34._28_4_ = fVar203;
          uVar20 = vcmpps_avx512vl(auVar177,auVar34,2);
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar178,auVar35);
          bVar64 = (bool)((byte)local_748 & 1);
          local_3c0._0_4_ = (uint)bVar64 * auVar94._0_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)((byte)(local_748 >> 1) & 1);
          local_3c0._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)((byte)(local_748 >> 2) & 1);
          fStack_3b8 = (float)((uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_748 >> 3) & 1);
          fStack_3b4 = (float)((uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_748 >> 4) & 1);
          fStack_3b0 = (float)((uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_748 >> 5) & 1);
          fStack_3ac = (float)((uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_748 >> 6) & 1);
          fStack_3a8 = (float)((uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_748 >> 7) & 1);
          fStack_3a4 = (float)((uint)bVar64 * auVar94._28_4_ | (uint)!bVar64 * 2);
          bVar55 = (byte)uVar21 & bVar55 & (byte)uVar20;
          uVar20 = vpcmpd_avx512vl(_local_3c0,local_360,2);
          local_400 = _local_320;
          local_3a0 = (float)local_3e0._0_4_ + (float)local_320._0_4_;
          fStack_39c = (float)local_3e0._4_4_ + (float)local_320._4_4_;
          fStack_398 = fStack_3d8 + fStack_318;
          fStack_394 = fStack_3d4 + fStack_314;
          fStack_390 = fStack_3d0 + fStack_310;
          fStack_38c = fStack_3cc + fStack_30c;
          fStack_388 = fStack_3c8 + fStack_308;
          fStack_384 = fStack_3c4 + fStack_304;
          for (bVar59 = (byte)uVar20 & bVar55; auVar94 = local_8e0, bVar59 != 0;
              bVar59 = ~bVar58 & bVar59 & (byte)uVar20) {
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar156,local_400);
            auVar130._0_4_ =
                 (uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar64 * auVar91._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar64 * auVar91._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar64 * auVar91._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar64 * auVar91._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar64 * auVar91._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar64 * auVar91._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar130._28_4_ =
                 (uint)(bVar59 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar91 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar91 = vminps_avx(auVar130,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar20 = vcmpps_avx512vl(auVar130,auVar91,0);
            bVar56 = (byte)uVar20 & bVar59;
            bVar58 = bVar59;
            if (bVar56 != 0) {
              bVar58 = bVar56;
            }
            iVar23 = 0;
            for (uVar66 = (uint)bVar58; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            bVar58 = '\x01' << ((byte)iVar23 & 0x1f);
            auVar242 = ZEXT464(*(uint *)(local_300 + (uint)(iVar23 << 2)));
            aVar2 = (ray->dir).field_0;
            local_520._0_16_ = (undefined1  [16])aVar2;
            auVar82 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar82._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar59;
              local_8e0._2_30_ = auVar94._2_30_;
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
              local_6c0._0_16_ = ZEXT416(*(uint *)(local_300 + (uint)(iVar23 << 2)));
              auVar248 = ZEXT1664(auVar248._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar203 = sqrtf(auVar82._0_4_);
              auVar242 = ZEXT1664(local_6c0._0_16_);
              bVar59 = local_8e0[0];
              auVar281 = ZEXT3264(local_7c0);
              auVar280 = ZEXT3264(local_740);
              auVar279 = ZEXT3264(local_720);
              auVar278 = ZEXT3264(local_700);
              auVar276 = ZEXT3264(local_8c0);
              auVar274 = ZEXT3264(local_8a0);
              auVar273 = ZEXT3264(local_880);
              auVar94 = vmovdqa64_avx512vl(local_860);
              auVar272 = ZEXT3264(auVar94);
              auVar94 = vmovdqa64_avx512vl(local_840);
              auVar271 = ZEXT3264(auVar94);
              auVar270 = ZEXT3264(local_820);
              auVar94 = vmovdqa64_avx512vl(local_800);
              auVar269 = ZEXT3264(auVar94);
              auVar275 = ZEXT3264(local_7e0);
              auVar277 = ZEXT3264(local_6e0);
              auVar82 = local_7a0._0_16_;
            }
            else {
              auVar82 = vsqrtss_avx(auVar82,auVar82);
              fVar203 = auVar82._0_4_;
              auVar82 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
            }
            uVar65 = (ulong)bVar58;
            auVar84 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar88 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar235 = ZEXT3264(_local_5c0);
            auVar83 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar90 = vminps_avx(auVar84,auVar83);
            auVar84 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar83 = vmaxps_avx(auVar88,auVar84);
            auVar213._8_4_ = 0x7fffffff;
            auVar213._0_8_ = 0x7fffffff7fffffff;
            auVar213._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar90,auVar213);
            auVar84 = vandps_avx(auVar83,auVar213);
            auVar88 = vmaxps_avx(auVar88,auVar84);
            auVar84 = vmovshdup_avx(auVar88);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            fVar243 = auVar88._0_4_ * 1.9073486e-06;
            local_4f0 = vshufps_avx(auVar83,auVar83,0xff);
            auVar82 = vinsertps_avx(auVar242._0_16_,auVar82,0x10);
            auVar252 = ZEXT1664(auVar82);
            uVar62 = 0;
            while( true ) {
              bVar56 = (byte)uVar65;
              if (uVar62 == 5) break;
              uVar140 = auVar252._0_4_;
              auVar148._4_4_ = uVar140;
              auVar148._0_4_ = uVar140;
              auVar148._8_4_ = uVar140;
              auVar148._12_4_ = uVar140;
              auVar88 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_520._0_16_);
              _local_540 = auVar252._0_16_;
              auVar82 = vmovshdup_avx(auVar252._0_16_);
              fVar223 = auVar82._0_4_;
              fVar222 = 1.0 - fVar223;
              fVar251 = fVar222 * fVar222 * fVar222;
              fVar249 = fVar223 * fVar223;
              fVar267 = fVar249 * fVar223;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar267));
              fVar250 = fVar223 * fVar222;
              local_7a0._0_16_ = ZEXT416((uint)fVar222);
              local_8e0._0_16_ = auVar82;
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar223 * 6.0)),
                                        ZEXT416((uint)(fVar250 * fVar222)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                        ZEXT416((uint)fVar251));
              auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar222 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar250 * fVar223)));
              fVar251 = fVar251 * 0.16666667;
              fVar222 = (auVar84._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar223 = (auVar82._0_4_ + auVar90._0_4_) * 0.16666667;
              fVar267 = fVar267 * 0.16666667;
              auVar191._0_4_ = fVar267 * (float)local_5c0._0_4_;
              auVar191._4_4_ = fVar267 * (float)local_5c0._4_4_;
              auVar191._8_4_ = fVar267 * fStack_5b8;
              auVar191._12_4_ = fVar267 * fStack_5b4;
              auVar226._4_4_ = fVar223;
              auVar226._0_4_ = fVar223;
              auVar226._8_4_ = fVar223;
              auVar226._12_4_ = fVar223;
              auVar82 = vfmadd132ps_fma(auVar226,auVar191,local_580._0_16_);
              auVar192._4_4_ = fVar222;
              auVar192._0_4_ = fVar222;
              auVar192._8_4_ = fVar222;
              auVar192._12_4_ = fVar222;
              auVar82 = vfmadd132ps_fma(auVar192,auVar82,local_5a0._0_16_);
              auVar172._4_4_ = fVar251;
              auVar172._0_4_ = fVar251;
              auVar172._8_4_ = fVar251;
              auVar172._12_4_ = fVar251;
              auVar82 = vfmadd132ps_fma(auVar172,auVar82,local_560._0_16_);
              local_440._0_16_ = auVar82;
              auVar82 = vsubps_avx(auVar88,auVar82);
              local_6c0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_5e0._0_16_ = auVar82;
              if (auVar82._0_4_ < 0.0) {
                local_640._0_4_ = fVar249;
                local_660._0_4_ = fVar250;
                auVar235._0_4_ = sqrtf(auVar82._0_4_);
                auVar235._4_60_ = extraout_var_00;
                auVar82 = auVar235._0_16_;
                uVar65 = extraout_RAX_02;
                fVar250 = (float)local_660._0_4_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                local_640._0_4_ = fVar249;
              }
              local_460._4_4_ = local_7a0._0_4_;
              local_460._0_4_ = local_460._4_4_;
              fStack_458 = (float)local_460._4_4_;
              fStack_454 = (float)local_460._4_4_;
              auVar84 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                         ZEXT416((uint)(fVar250 * 4.0)));
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),local_7a0._0_16_,
                                        local_7a0._0_16_);
              fVar249 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
              fVar250 = auVar84._0_4_ * 0.5;
              fVar251 = auVar88._0_4_ * 0.5;
              local_640._0_4_ = (float)local_640._0_4_ * 0.5;
              auVar214._0_4_ = (float)local_640._0_4_ * (float)local_5c0._0_4_;
              auVar214._4_4_ = (float)local_640._0_4_ * (float)local_5c0._4_4_;
              auVar214._8_4_ = (float)local_640._0_4_ * fStack_5b8;
              auVar214._12_4_ = (float)local_640._0_4_ * fStack_5b4;
              auVar173._4_4_ = fVar251;
              auVar173._0_4_ = fVar251;
              auVar173._8_4_ = fVar251;
              auVar173._12_4_ = fVar251;
              auVar88 = vfmadd132ps_fma(auVar173,auVar214,local_580._0_16_);
              auVar193._4_4_ = fVar250;
              auVar193._0_4_ = fVar250;
              auVar193._8_4_ = fVar250;
              auVar193._12_4_ = fVar250;
              auVar88 = vfmadd132ps_fma(auVar193,auVar88,local_5a0._0_16_);
              auVar264._4_4_ = fVar249;
              auVar264._0_4_ = fVar249;
              auVar264._8_4_ = fVar249;
              auVar264._12_4_ = fVar249;
              local_640._0_16_ = vfmadd132ps_fma(auVar264,auVar88,local_560._0_16_);
              local_480._0_16_ = vdpps_avx(local_640._0_16_,local_640._0_16_,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar249 = local_480._0_4_;
              _local_760 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar249));
              fVar250 = local_760._0_4_;
              local_4a0._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar249));
              auVar88 = vfnmadd213ss_fma(local_4a0._0_16_,local_480._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar82._0_4_;
              if (fVar249 < -fVar249) {
                local_770._0_4_ = fVar249 * -0.5;
                fVar251 = sqrtf(fVar249);
                auVar82 = ZEXT416((uint)local_660._0_4_);
                uVar65 = extraout_RAX_03;
                fVar249 = (float)local_770._0_4_;
                auVar84 = local_640._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
                fVar251 = auVar84._0_4_;
                fVar249 = fVar249 * -0.5;
                auVar84 = local_640._0_16_;
              }
              fVar222 = local_760._0_4_;
              local_760._4_4_ = fVar250 * 1.5 + fVar249 * fVar222 * fVar222 * fVar222;
              local_760._0_4_ = local_760._4_4_;
              fStack_758 = (float)local_760._4_4_;
              fStack_754 = (float)local_760._4_4_;
              auVar266._0_4_ = auVar84._0_4_ * (float)local_760._4_4_;
              auVar266._4_4_ = auVar84._4_4_ * (float)local_760._4_4_;
              auVar266._8_4_ = auVar84._8_4_ * (float)local_760._4_4_;
              auVar266._12_4_ = auVar84._12_4_ * (float)local_760._4_4_;
              auVar83 = vdpps_avx(local_6c0._0_16_,auVar266,0x7f);
              fVar250 = auVar82._0_4_;
              auVar149._0_4_ = auVar83._0_4_ * auVar83._0_4_;
              auVar149._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar149._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar149._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar90 = vsubps_avx(local_5e0._0_16_,auVar149);
              fVar249 = auVar90._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar249;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar72 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar90,ZEXT416(0xbf000000));
              if (fVar249 < 0.0) {
                local_4e0 = auVar78._0_4_;
                local_770 = auVar83;
                local_4d0 = auVar266;
                local_4c0 = auVar89;
                fVar249 = sqrtf(fVar249);
                auVar78 = ZEXT416((uint)local_4e0);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar82 = ZEXT416((uint)local_660._0_4_);
                uVar65 = extraout_RAX_04;
                auVar89 = local_4c0;
                auVar84 = local_640._0_16_;
                auVar83 = local_770;
                auVar266 = local_4d0;
              }
              else {
                auVar90 = vsqrtss_avx(auVar90,auVar90);
                fVar249 = auVar90._0_4_;
              }
              auVar265 = ZEXT1664(auVar84);
              auVar261 = ZEXT1664(local_5e0._0_16_);
              auVar257 = ZEXT1664(local_6c0._0_16_);
              auVar277 = ZEXT3264(local_6e0);
              auVar275 = ZEXT3264(local_7e0);
              auVar94 = vmovdqa64_avx512vl(local_800);
              auVar269 = ZEXT3264(auVar94);
              auVar270 = ZEXT3264(local_820);
              auVar94 = vmovdqa64_avx512vl(local_840);
              auVar271 = ZEXT3264(auVar94);
              auVar94 = vmovdqa64_avx512vl(local_860);
              auVar272 = ZEXT3264(auVar94);
              auVar273 = ZEXT3264(local_880);
              auVar274 = ZEXT3264(local_8a0);
              auVar276 = ZEXT3264(local_8c0);
              auVar278 = ZEXT3264(local_700);
              auVar279 = ZEXT3264(local_720);
              auVar280 = ZEXT3264(local_740);
              auVar281 = ZEXT3264(local_7c0);
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                        local_8e0._0_16_);
              auVar75 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_7a0._0_16_);
              auVar90 = vshufps_avx(_local_540,_local_540,0x55);
              auVar194._0_4_ = auVar90._0_4_ * (float)local_5c0._0_4_;
              auVar194._4_4_ = auVar90._4_4_ * (float)local_5c0._4_4_;
              auVar194._8_4_ = auVar90._8_4_ * fStack_5b8;
              auVar194._12_4_ = auVar90._12_4_ * fStack_5b4;
              auVar215._0_4_ = auVar75._0_4_;
              auVar215._4_4_ = auVar215._0_4_;
              auVar215._8_4_ = auVar215._0_4_;
              auVar215._12_4_ = auVar215._0_4_;
              auVar90 = vfmadd132ps_fma(auVar215,auVar194,local_580._0_16_);
              auVar175._0_4_ = auVar74._0_4_;
              auVar175._4_4_ = auVar175._0_4_;
              auVar175._8_4_ = auVar175._0_4_;
              auVar175._12_4_ = auVar175._0_4_;
              auVar90 = vfmadd132ps_fma(auVar175,auVar90,local_5a0._0_16_);
              auVar90 = vfmadd132ps_fma(_local_460,auVar90,local_560._0_16_);
              auVar176._0_4_ = auVar90._0_4_ * (float)local_480._0_4_;
              auVar176._4_4_ = auVar90._4_4_ * (float)local_480._0_4_;
              auVar176._8_4_ = auVar90._8_4_ * (float)local_480._0_4_;
              auVar176._12_4_ = auVar90._12_4_ * (float)local_480._0_4_;
              auVar90 = vdpps_avx(auVar84,auVar90,0x7f);
              fVar222 = auVar90._0_4_;
              auVar195._0_4_ = auVar84._0_4_ * fVar222;
              auVar195._4_4_ = auVar84._4_4_ * fVar222;
              auVar195._8_4_ = auVar84._8_4_ * fVar222;
              auVar195._12_4_ = auVar84._12_4_ * fVar222;
              auVar90 = vsubps_avx(auVar176,auVar195);
              fVar222 = auVar88._0_4_ * (float)local_4a0._0_4_;
              auVar74 = vmaxss_avx(ZEXT416((uint)fVar243),
                                   ZEXT416((uint)(local_540._0_4_ * fVar203 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar84,auVar27);
              auVar196._0_4_ = auVar90._0_4_ * fVar222 * (float)local_760._0_4_;
              auVar196._4_4_ = auVar90._4_4_ * fVar222 * (float)local_760._4_4_;
              auVar196._8_4_ = auVar90._8_4_ * fVar222 * fStack_758;
              auVar196._12_4_ = auVar90._12_4_ * fVar222 * fStack_754;
              auVar88 = vdpps_avx(auVar76,auVar266,0x7f);
              auVar90 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar243),auVar74);
              auVar82 = vdpps_avx(local_6c0._0_16_,auVar196,0x7f);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar250 + 1.0)),
                                        ZEXT416((uint)(fVar243 / fVar251)),auVar90);
              fVar250 = auVar88._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_520._0_16_,auVar266,0x7f);
              auVar88 = vdpps_avx(local_6c0._0_16_,auVar76,0x7f);
              auVar90 = vmulss_avx512f(auVar78,auVar89);
              auVar78 = vaddss_avx512f(auVar72,ZEXT416((uint)(auVar90._0_4_ *
                                                             auVar89._0_4_ * auVar89._0_4_)));
              auVar90 = vdpps_avx(local_6c0._0_16_,local_520._0_16_,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar88,auVar83,ZEXT416((uint)fVar250));
              auVar90 = vfnmadd231ss_fma(auVar90,auVar83,auVar82);
              auVar88 = vpermilps_avx(local_440._0_16_,0xff);
              fVar249 = fVar249 - auVar88._0_4_;
              auVar89 = vshufps_avx(auVar84,auVar84,0xff);
              auVar88 = vfmsub213ss_fma(auVar72,auVar78,auVar89);
              auVar247._8_4_ = 0x80000000;
              auVar247._0_8_ = 0x8000000080000000;
              auVar247._12_4_ = 0x80000000;
              auVar248 = ZEXT1664(auVar247);
              auVar239._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar242 = ZEXT1664(auVar239);
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * auVar78._0_4_));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar250),auVar90);
              auVar88 = vinsertps_avx(auVar239,auVar90,0x1c);
              auVar233._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar250),auVar233,0x10);
              auVar216._0_4_ = auVar72._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar82 = vdivps_avx(auVar88,auVar216);
              auVar88 = vdivps_avx(auVar90,auVar216);
              fVar250 = auVar83._0_4_;
              auVar235 = ZEXT1664(CONCAT412(fVar249,CONCAT48(fVar249,CONCAT44(fVar249,fVar249))));
              auVar217._0_4_ = fVar250 * auVar82._0_4_ + fVar249 * auVar88._0_4_;
              auVar217._4_4_ = fVar250 * auVar82._4_4_ + fVar249 * auVar88._4_4_;
              auVar217._8_4_ = fVar250 * auVar82._8_4_ + fVar249 * auVar88._8_4_;
              auVar217._12_4_ = fVar250 * auVar82._12_4_ + fVar249 * auVar88._12_4_;
              auVar82 = vsubps_avx(_local_540,auVar217);
              auVar252 = ZEXT1664(auVar82);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar83,auVar28);
              if (auVar88._0_4_ < auVar75._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar74._0_4_)),local_4f0,
                                          ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar249),auVar29);
                if (auVar83._0_4_ < auVar88._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar203 = auVar82._0_4_ + (float)local_500._0_4_;
                  bVar56 = 0;
                  if ((fVar203 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar203))
                  goto LAB_018ce6a4;
                  auVar88 = vmovshdup_avx(auVar82);
                  fVar243 = auVar88._0_4_;
                  bVar56 = 0;
                  if ((fVar243 < 0.0) || (bVar56 = 0, 1.0 < fVar243)) goto LAB_018ce6a4;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                  fVar250 = auVar88._0_4_;
                  fVar249 = local_5e0._0_4_ * -0.5;
                  auVar235 = ZEXT464((uint)fVar249);
                  pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                  if ((pGVar4->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar56 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_018ce6a4;
                    local_8e0._0_4_ = ray->tfar;
                    fVar249 = fVar250 * 1.5 + fVar249 * fVar250 * fVar250 * fVar250;
                    auVar218._0_4_ = local_6c0._0_4_ * fVar249;
                    auVar218._4_4_ = local_6c0._4_4_ * fVar249;
                    auVar218._8_4_ = local_6c0._8_4_ * fVar249;
                    auVar218._12_4_ = local_6c0._12_4_ * fVar249;
                    auVar89 = vfmadd213ps_fma(auVar89,auVar218,auVar84);
                    auVar88 = vshufps_avx(auVar218,auVar218,0xc9);
                    auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar219._0_4_ = auVar218._0_4_ * auVar83._0_4_;
                    auVar219._4_4_ = auVar218._4_4_ * auVar83._4_4_;
                    auVar219._8_4_ = auVar218._8_4_ * auVar83._8_4_;
                    auVar219._12_4_ = auVar218._12_4_ * auVar83._12_4_;
                    auVar90 = vfmsub231ps_fma(auVar219,auVar84,auVar88);
                    auVar88 = vshufps_avx(auVar90,auVar90,0xc9);
                    auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                    auVar235 = ZEXT1664(auVar83);
                    auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                    auVar150._0_4_ = auVar89._0_4_ * auVar90._0_4_;
                    auVar150._4_4_ = auVar89._4_4_ * auVar90._4_4_;
                    auVar150._8_4_ = auVar89._8_4_ * auVar90._8_4_;
                    auVar150._12_4_ = auVar89._12_4_ * auVar90._12_4_;
                    auVar90 = vfmsub231ps_fma(auVar150,auVar88,auVar83);
                    auVar88 = vshufps_avx(auVar90,auVar90,0xe9);
                    local_620 = vmovlps_avx(auVar88);
                    local_618 = auVar90._0_4_;
                    local_610 = 0;
                    local_60c = (undefined4)local_5e8;
                    local_608 = (undefined4)local_8e8;
                    local_604 = context->user->instID[0];
                    local_600 = context->user->instPrimID[0];
                    ray->tfar = fVar203;
                    local_8ec = -1;
                    local_690.valid = &local_8ec;
                    local_690.geometryUserPtr = pGVar4->userPtr;
                    local_690.context = context->user;
                    local_690.hit = (RTCHitN *)&local_620;
                    local_690.N = 1;
                    local_7a0._0_8_ = pGVar4;
                    local_690.ray = (RTCRayN *)ray;
                    local_614 = fVar243;
                    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018ce90b:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar235 = ZEXT1664(auVar235._0_16_);
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        auVar252 = ZEXT1664(auVar252._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        (*p_Var8)(&local_690);
                        auVar281 = ZEXT3264(local_7c0);
                        auVar280 = ZEXT3264(local_740);
                        auVar279 = ZEXT3264(local_720);
                        auVar278 = ZEXT3264(local_700);
                        auVar276 = ZEXT3264(local_8c0);
                        auVar274 = ZEXT3264(local_8a0);
                        auVar273 = ZEXT3264(local_880);
                        auVar94 = vmovdqa64_avx512vl(local_860);
                        auVar272 = ZEXT3264(auVar94);
                        auVar94 = vmovdqa64_avx512vl(local_840);
                        auVar271 = ZEXT3264(auVar94);
                        auVar270 = ZEXT3264(local_820);
                        auVar94 = vmovdqa64_avx512vl(local_800);
                        auVar269 = ZEXT3264(auVar94);
                        auVar275 = ZEXT3264(local_7e0);
                        auVar277 = ZEXT3264(local_6e0);
                        if (*local_690.valid == 0) goto LAB_018ce9c1;
                      }
                      bVar56 = 1;
                      goto LAB_018ce6a4;
                    }
                    auVar235 = ZEXT1664(auVar83);
                    auVar242 = ZEXT1664(auVar239);
                    auVar248 = ZEXT1664(auVar247);
                    auVar252 = ZEXT1664(auVar82);
                    auVar257 = ZEXT1664(local_6c0._0_16_);
                    auVar261 = ZEXT1664(local_5e0._0_16_);
                    auVar265 = ZEXT1664(auVar84);
                    (*pGVar4->occlusionFilterN)(&local_690);
                    auVar281 = ZEXT3264(local_7c0);
                    auVar280 = ZEXT3264(local_740);
                    auVar279 = ZEXT3264(local_720);
                    auVar278 = ZEXT3264(local_700);
                    auVar276 = ZEXT3264(local_8c0);
                    auVar274 = ZEXT3264(local_8a0);
                    auVar273 = ZEXT3264(local_880);
                    auVar94 = vmovdqa64_avx512vl(local_860);
                    auVar272 = ZEXT3264(auVar94);
                    auVar94 = vmovdqa64_avx512vl(local_840);
                    auVar271 = ZEXT3264(auVar94);
                    auVar270 = ZEXT3264(local_820);
                    auVar94 = vmovdqa64_avx512vl(local_800);
                    auVar269 = ZEXT3264(auVar94);
                    auVar275 = ZEXT3264(local_7e0);
                    auVar277 = ZEXT3264(local_6e0);
                    if (*local_690.valid != 0) goto LAB_018ce90b;
LAB_018ce9c1:
                    ray->tfar = (float)local_8e0._0_4_;
                  }
                  bVar56 = 0;
                  goto LAB_018ce6a4;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar64 = false;
LAB_018ce6a4:
            bVar63 = bVar63 | bVar64 & bVar56;
            fVar243 = ray->tfar;
            auVar54._4_4_ = fStack_39c;
            auVar54._0_4_ = local_3a0;
            auVar54._8_4_ = fStack_398;
            auVar54._12_4_ = fStack_394;
            auVar54._16_4_ = fStack_390;
            auVar54._20_4_ = fStack_38c;
            auVar54._24_4_ = fStack_388;
            auVar54._28_4_ = fStack_384;
            fVar203 = ray->tfar;
            auVar36._4_4_ = fVar203;
            auVar36._0_4_ = fVar203;
            auVar36._8_4_ = fVar203;
            auVar36._12_4_ = fVar203;
            auVar36._16_4_ = fVar203;
            auVar36._20_4_ = fVar203;
            auVar36._24_4_ = fVar203;
            auVar36._28_4_ = fVar203;
            uVar20 = vcmpps_avx512vl(auVar54,auVar36,2);
          }
          uVar22 = vpcmpd_avx512vl(local_360,local_2a0,1);
          uVar21 = vpcmpd_avx512vl(local_360,_local_3c0,1);
          auVar198._0_4_ = (float)local_3e0._0_4_ + (float)local_2e0._0_4_;
          auVar198._4_4_ = (float)local_3e0._4_4_ + (float)local_2e0._4_4_;
          auVar198._8_4_ = fStack_3d8 + fStack_2d8;
          auVar198._12_4_ = fStack_3d4 + fStack_2d4;
          auVar198._16_4_ = fStack_3d0 + fStack_2d0;
          auVar198._20_4_ = fStack_3cc + fStack_2cc;
          auVar198._24_4_ = fStack_3c8 + fStack_2c8;
          auVar198._28_4_ = fStack_3c4 + fStack_2c4;
          auVar220._4_4_ = fVar243;
          auVar220._0_4_ = fVar243;
          auVar220._8_4_ = fVar243;
          auVar220._12_4_ = fVar243;
          auVar220._16_4_ = fVar243;
          auVar220._20_4_ = fVar243;
          auVar220._24_4_ = fVar243;
          auVar220._28_4_ = fVar243;
          uVar20 = vcmpps_avx512vl(auVar198,auVar220,2);
          bVar59 = (byte)local_744 & (byte)uVar22 & (byte)uVar20;
          auVar199._0_4_ = (float)local_3e0._0_4_ + (float)local_320._0_4_;
          auVar199._4_4_ = (float)local_3e0._4_4_ + (float)local_320._4_4_;
          auVar199._8_4_ = fStack_3d8 + fStack_318;
          auVar199._12_4_ = fStack_3d4 + fStack_314;
          auVar199._16_4_ = fStack_3d0 + fStack_310;
          auVar199._20_4_ = fStack_3cc + fStack_30c;
          auVar199._24_4_ = fStack_3c8 + fStack_308;
          auVar199._28_4_ = fStack_3c4 + fStack_304;
          uVar20 = vcmpps_avx512vl(auVar199,auVar220,2);
          bVar55 = bVar55 & (byte)uVar21 & (byte)uVar20 | bVar59;
          prim = local_5f0;
          if (bVar55 != 0) {
            abStack_180[uVar57 * 0x60] = bVar55;
            bVar64 = (bool)(bVar59 >> 1 & 1);
            bVar9 = (bool)(bVar59 >> 2 & 1);
            bVar10 = (bool)(bVar59 >> 3 & 1);
            bVar11 = (bool)(bVar59 >> 4 & 1);
            bVar12 = (bool)(bVar59 >> 5 & 1);
            bVar13 = (bool)(bVar59 >> 6 & 1);
            auStack_160[uVar57 * 0x18] =
                 (uint)(bVar59 & 1) * local_2e0._0_4_ | (uint)!(bool)(bVar59 & 1) * local_320._0_4_;
            auStack_160[uVar57 * 0x18 + 1] =
                 (uint)bVar64 * local_2e0._4_4_ | (uint)!bVar64 * local_320._4_4_;
            auStack_160[uVar57 * 0x18 + 2] =
                 (uint)bVar9 * (int)fStack_2d8 | (uint)!bVar9 * (int)fStack_318;
            auStack_160[uVar57 * 0x18 + 3] =
                 (uint)bVar10 * (int)fStack_2d4 | (uint)!bVar10 * (int)fStack_314;
            auStack_160[uVar57 * 0x18 + 4] =
                 (uint)bVar11 * (int)fStack_2d0 | (uint)!bVar11 * (int)fStack_310;
            auStack_160[uVar57 * 0x18 + 5] =
                 (uint)bVar12 * (int)fStack_2cc | (uint)!bVar12 * (int)fStack_30c;
            auStack_160[uVar57 * 0x18 + 6] =
                 (uint)bVar13 * (int)fStack_2c8 | (uint)!bVar13 * (int)fStack_308;
            auStack_160[uVar57 * 0x18 + 7] =
                 (uint)(bVar59 >> 7) * (int)fStack_2c4 |
                 (uint)!(bool)(bVar59 >> 7) * (int)fStack_304;
            uVar65 = vmovlps_avx(local_370);
            (&uStack_140)[uVar57 * 0xc] = uVar65;
            aiStack_138[uVar57 * 0x18] = local_904 + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
        }
      }
    }
    fVar243 = ray->tfar;
    fVar203 = ray->tfar;
    auVar179._4_4_ = fVar203;
    auVar179._0_4_ = fVar203;
    auVar179._8_4_ = fVar203;
    auVar179._12_4_ = fVar203;
    auVar179._16_4_ = fVar203;
    auVar179._20_4_ = fVar203;
    auVar179._24_4_ = fVar203;
    auVar179._28_4_ = fVar203;
    do {
      uVar66 = (uint)uVar57;
      uVar57 = (ulong)(uVar66 - 1);
      if (uVar66 == 0) {
        if (bVar63 != 0) goto LAB_018cec2b;
        auVar152._4_4_ = fVar243;
        auVar152._0_4_ = fVar243;
        auVar152._8_4_ = fVar243;
        auVar152._12_4_ = fVar243;
        uVar20 = vcmpps_avx512vl(auVar152,local_380,0xd);
        local_4a8 = (ulong)((uint)uVar20 & (uint)local_4a8 - 1 & (uint)local_4a8);
        goto LAB_018cc3b9;
      }
      auVar94 = *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x18);
      auVar221._0_4_ = auVar94._0_4_ + (float)local_3e0._0_4_;
      auVar221._4_4_ = auVar94._4_4_ + (float)local_3e0._4_4_;
      auVar221._8_4_ = auVar94._8_4_ + fStack_3d8;
      auVar221._12_4_ = auVar94._12_4_ + fStack_3d4;
      auVar221._16_4_ = auVar94._16_4_ + fStack_3d0;
      auVar221._20_4_ = auVar94._20_4_ + fStack_3cc;
      auVar221._24_4_ = auVar94._24_4_ + fStack_3c8;
      auVar221._28_4_ = auVar94._28_4_ + fStack_3c4;
      uVar20 = vcmpps_avx512vl(auVar221,auVar179,2);
      uVar132 = (uint)uVar20 & (uint)abStack_180[uVar57 * 0x60];
    } while (uVar132 == 0);
    uVar65 = (&uStack_140)[uVar57 * 0xc];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar65;
    auVar180._8_4_ = 0x7f800000;
    auVar180._0_8_ = 0x7f8000007f800000;
    auVar180._12_4_ = 0x7f800000;
    auVar180._16_4_ = 0x7f800000;
    auVar180._20_4_ = 0x7f800000;
    auVar180._24_4_ = 0x7f800000;
    auVar180._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar180,auVar94);
    bVar55 = (byte)uVar132;
    auVar131._0_4_ = (uint)(bVar55 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar132 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * 0x7f800000;
    auVar131._28_4_ = (uVar132 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar132 >> 7,0) * 0x7f800000;
    auVar94 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar94 = vminps_avx(auVar131,auVar94);
    auVar91 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar91);
    auVar91 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar91);
    uVar20 = vcmpps_avx512vl(auVar131,auVar94,0);
    bVar59 = (byte)uVar20 & bVar55;
    if (bVar59 != 0) {
      uVar132 = (uint)bVar59;
    }
    uVar133 = 0;
    for (; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x80000000) {
      uVar133 = uVar133 + 1;
    }
    local_904 = aiStack_138[uVar57 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar55;
    abStack_180[uVar57 * 0x60] = bVar55;
    if (bVar55 == 0) {
      uVar66 = uVar66 - 1;
    }
    uVar140 = (undefined4)uVar65;
    auVar181._4_4_ = uVar140;
    auVar181._0_4_ = uVar140;
    auVar181._8_4_ = uVar140;
    auVar181._12_4_ = uVar140;
    auVar181._16_4_ = uVar140;
    auVar181._20_4_ = uVar140;
    auVar181._24_4_ = uVar140;
    auVar181._28_4_ = uVar140;
    auVar82 = vmovshdup_avx(auVar151);
    auVar82 = vsubps_avx(auVar82,auVar151);
    auVar157._0_4_ = auVar82._0_4_;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar157._16_4_ = auVar157._0_4_;
    auVar157._20_4_ = auVar157._0_4_;
    auVar157._24_4_ = auVar157._0_4_;
    auVar157._28_4_ = auVar157._0_4_;
    auVar82 = vfmadd132ps_fma(auVar157,auVar181,_DAT_01f7b040);
    _local_2e0 = ZEXT1632(auVar82);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar133 * 4);
    uVar57 = (ulong)uVar66;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }